

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  uint uVar73;
  uint uVar74;
  long lVar75;
  ulong uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  uint uVar80;
  bool bVar81;
  float fVar82;
  float fVar113;
  float fVar115;
  __m128 a;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar117;
  undefined1 auVar100 [32];
  float fVar83;
  undefined1 auVar101 [32];
  float fVar114;
  float fVar116;
  float fVar118;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar112 [32];
  float fVar122;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar154;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar153;
  float fVar155;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar173;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar160 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [28];
  float fVar220;
  float fVar221;
  undefined1 auVar210 [32];
  undefined1 auVar200 [16];
  float fVar219;
  float fVar222;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar260 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar223;
  float fVar224;
  float fVar243;
  float fVar245;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  float fVar249;
  float fVar251;
  undefined1 auVar232 [32];
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar255;
  undefined1 auVar259 [16];
  float fVar274;
  float fVar275;
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar286;
  float fVar287;
  float fVar290;
  float fVar291;
  float fVar294;
  float fVar295;
  float fVar297;
  undefined1 auVar268 [32];
  float fVar276;
  float fVar280;
  float fVar284;
  float fVar288;
  float fVar292;
  float fVar296;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [28];
  float fVar273;
  float fVar277;
  float fVar285;
  float fVar289;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar281;
  float fVar293;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  float fVar298;
  undefined1 auVar299 [16];
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar311;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar315 [16];
  float fVar321;
  float fVar322;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar329 [32];
  float fVar327;
  undefined1 auVar330 [32];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar328 [32];
  undefined1 auVar331 [64];
  float fVar338;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  undefined1 auVar353 [16];
  float fVar352;
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar363;
  float in_register_0000151c;
  undefined1 auVar354 [32];
  float fVar360;
  float fVar364;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar365;
  float fVar366;
  undefined1 auVar367 [16];
  float fVar370;
  float fVar372;
  float fVar376;
  float fVar378;
  float fVar380;
  undefined1 auVar368 [32];
  float fVar371;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar377;
  float fVar379;
  float fVar381;
  float fVar382;
  undefined1 auVar369 [32];
  undefined1 auVar383 [16];
  float in_register_0000159c;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [64];
  float fVar388;
  undefined1 auVar387 [28];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ca8;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 (*local_a88) [16];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  Primitive *local_8c8;
  uint local_8c0;
  undefined1 auStack_8bc [28];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined8 local_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  undefined1 auStack_720 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar6 = prim[1];
  uVar79 = (ulong)(byte)PVar6;
  local_8d0 = prim + uVar79 * 0x19 + 0x16;
  fVar298 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar125 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar125 = vinsertps_avx(auVar125,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar123._0_4_ = fVar298 * auVar15._0_4_;
  auVar123._4_4_ = fVar298 * auVar15._4_4_;
  auVar123._8_4_ = fVar298 * auVar15._8_4_;
  auVar123._12_4_ = fVar298 * auVar15._12_4_;
  auVar225._0_4_ = fVar298 * auVar125._0_4_;
  auVar225._4_4_ = fVar298 * auVar125._4_4_;
  auVar225._8_4_ = fVar298 * auVar125._8_4_;
  auVar225._12_4_ = fVar298 * auVar125._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 10)));
  auVar95._16_16_ = auVar125;
  auVar95._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 10)));
  auVar161._16_16_ = auVar125;
  auVar161._0_16_ = auVar15;
  auVar107 = vcvtdq2ps_avx(auVar161);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 10)));
  auVar191._16_16_ = auVar125;
  auVar191._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 10)));
  auVar10 = vcvtdq2ps_avx(auVar191);
  auVar192._16_16_ = auVar125;
  auVar192._0_16_ = auVar15;
  auVar11 = vcvtdq2ps_avx(auVar192);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xc + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xc + 10)));
  auVar264._16_16_ = auVar125;
  auVar264._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xd + 6)));
  auVar12 = vcvtdq2ps_avx(auVar264);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xd + 10)));
  auVar300._16_16_ = auVar125;
  auVar300._0_16_ = auVar15;
  auVar13 = vcvtdq2ps_avx(auVar300);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x12 + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x12 + 10)));
  auVar301._16_16_ = auVar125;
  auVar301._0_16_ = auVar15;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x13 + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x13 + 10)));
  auVar212 = vcvtdq2ps_avx(auVar301);
  auVar323._16_16_ = auVar125;
  auVar323._0_16_ = auVar15;
  auVar14 = vcvtdq2ps_avx(auVar323);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x14 + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x14 + 10)));
  auVar328._16_16_ = auVar125;
  auVar328._0_16_ = auVar15;
  auVar213 = vcvtdq2ps_avx(auVar328);
  auVar15 = vshufps_avx(auVar225,auVar225,0);
  auVar125 = vshufps_avx(auVar225,auVar225,0x55);
  auVar18 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar298 = auVar18._0_4_;
  fVar309 = auVar18._4_4_;
  fVar310 = auVar18._8_4_;
  fVar311 = auVar18._12_4_;
  fVar312 = auVar125._0_4_;
  fVar313 = auVar125._4_4_;
  fVar314 = auVar125._8_4_;
  fVar255 = auVar125._12_4_;
  fVar223 = auVar15._0_4_;
  fVar273 = auVar15._4_4_;
  fVar243 = auVar15._8_4_;
  fVar277 = auVar15._12_4_;
  auVar354._0_4_ = fVar223 * auVar95._0_4_ + fVar312 * auVar107._0_4_ + fVar298 * auVar10._0_4_;
  auVar354._4_4_ = fVar273 * auVar95._4_4_ + fVar313 * auVar107._4_4_ + fVar309 * auVar10._4_4_;
  auVar354._8_4_ = fVar243 * auVar95._8_4_ + fVar314 * auVar107._8_4_ + fVar310 * auVar10._8_4_;
  auVar354._12_4_ = fVar277 * auVar95._12_4_ + fVar255 * auVar107._12_4_ + fVar311 * auVar10._12_4_;
  auVar354._16_4_ = fVar223 * auVar95._16_4_ + fVar312 * auVar107._16_4_ + fVar298 * auVar10._16_4_;
  auVar354._20_4_ = fVar273 * auVar95._20_4_ + fVar313 * auVar107._20_4_ + fVar309 * auVar10._20_4_;
  auVar354._24_4_ = fVar243 * auVar95._24_4_ + fVar314 * auVar107._24_4_ + fVar310 * auVar10._24_4_;
  auVar354._28_4_ = fVar255 + in_register_000015dc + in_register_0000151c;
  auVar339._0_4_ = fVar223 * auVar11._0_4_ + fVar312 * auVar12._0_4_ + auVar13._0_4_ * fVar298;
  auVar339._4_4_ = fVar273 * auVar11._4_4_ + fVar313 * auVar12._4_4_ + auVar13._4_4_ * fVar309;
  auVar339._8_4_ = fVar243 * auVar11._8_4_ + fVar314 * auVar12._8_4_ + auVar13._8_4_ * fVar310;
  auVar339._12_4_ = fVar277 * auVar11._12_4_ + fVar255 * auVar12._12_4_ + auVar13._12_4_ * fVar311;
  auVar339._16_4_ = fVar223 * auVar11._16_4_ + fVar312 * auVar12._16_4_ + auVar13._16_4_ * fVar298;
  auVar339._20_4_ = fVar273 * auVar11._20_4_ + fVar313 * auVar12._20_4_ + auVar13._20_4_ * fVar309;
  auVar339._24_4_ = fVar243 * auVar11._24_4_ + fVar314 * auVar12._24_4_ + auVar13._24_4_ * fVar310;
  auVar339._28_4_ = fVar255 + in_register_000015dc + in_register_0000159c;
  auVar232._0_4_ = fVar223 * auVar212._0_4_ + fVar312 * auVar14._0_4_ + auVar213._0_4_ * fVar298;
  auVar232._4_4_ = fVar273 * auVar212._4_4_ + fVar313 * auVar14._4_4_ + auVar213._4_4_ * fVar309;
  auVar232._8_4_ = fVar243 * auVar212._8_4_ + fVar314 * auVar14._8_4_ + auVar213._8_4_ * fVar310;
  auVar232._12_4_ = fVar277 * auVar212._12_4_ + fVar255 * auVar14._12_4_ + auVar213._12_4_ * fVar311
  ;
  auVar232._16_4_ = fVar223 * auVar212._16_4_ + fVar312 * auVar14._16_4_ + auVar213._16_4_ * fVar298
  ;
  auVar232._20_4_ = fVar273 * auVar212._20_4_ + fVar313 * auVar14._20_4_ + auVar213._20_4_ * fVar309
  ;
  auVar232._24_4_ = fVar243 * auVar212._24_4_ + fVar314 * auVar14._24_4_ + auVar213._24_4_ * fVar310
  ;
  auVar232._28_4_ = fVar277 + fVar255 + fVar311;
  auVar15 = vshufps_avx(auVar123,auVar123,0);
  auVar125 = vshufps_avx(auVar123,auVar123,0x55);
  auVar18 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar309 = auVar18._0_4_;
  fVar310 = auVar18._4_4_;
  fVar311 = auVar18._8_4_;
  fVar312 = auVar18._12_4_;
  fVar273 = auVar125._0_4_;
  fVar243 = auVar125._4_4_;
  fVar277 = auVar125._8_4_;
  fVar245 = auVar125._12_4_;
  fVar313 = auVar15._0_4_;
  fVar314 = auVar15._4_4_;
  fVar255 = auVar15._8_4_;
  fVar223 = auVar15._12_4_;
  fVar298 = auVar95._28_4_;
  auVar139._0_4_ = fVar313 * auVar95._0_4_ + fVar273 * auVar107._0_4_ + fVar309 * auVar10._0_4_;
  auVar139._4_4_ = fVar314 * auVar95._4_4_ + fVar243 * auVar107._4_4_ + fVar310 * auVar10._4_4_;
  auVar139._8_4_ = fVar255 * auVar95._8_4_ + fVar277 * auVar107._8_4_ + fVar311 * auVar10._8_4_;
  auVar139._12_4_ = fVar223 * auVar95._12_4_ + fVar245 * auVar107._12_4_ + fVar312 * auVar10._12_4_;
  auVar139._16_4_ = fVar313 * auVar95._16_4_ + fVar273 * auVar107._16_4_ + fVar309 * auVar10._16_4_;
  auVar139._20_4_ = fVar314 * auVar95._20_4_ + fVar243 * auVar107._20_4_ + fVar310 * auVar10._20_4_;
  auVar139._24_4_ = fVar255 * auVar95._24_4_ + fVar277 * auVar107._24_4_ + fVar311 * auVar10._24_4_;
  auVar139._28_4_ = fVar298 + auVar107._28_4_ + auVar10._28_4_;
  auVar210._0_4_ = fVar313 * auVar11._0_4_ + auVar13._0_4_ * fVar309 + fVar273 * auVar12._0_4_;
  auVar210._4_4_ = fVar314 * auVar11._4_4_ + auVar13._4_4_ * fVar310 + fVar243 * auVar12._4_4_;
  auVar210._8_4_ = fVar255 * auVar11._8_4_ + auVar13._8_4_ * fVar311 + fVar277 * auVar12._8_4_;
  auVar210._12_4_ = fVar223 * auVar11._12_4_ + auVar13._12_4_ * fVar312 + fVar245 * auVar12._12_4_;
  auVar210._16_4_ = fVar313 * auVar11._16_4_ + auVar13._16_4_ * fVar309 + fVar273 * auVar12._16_4_;
  auVar210._20_4_ = fVar314 * auVar11._20_4_ + auVar13._20_4_ * fVar310 + fVar243 * auVar12._20_4_;
  auVar210._24_4_ = fVar255 * auVar11._24_4_ + auVar13._24_4_ * fVar311 + fVar277 * auVar12._24_4_;
  auVar210._28_4_ = fVar298 + auVar13._28_4_ + auVar10._28_4_;
  auVar193._0_4_ = fVar313 * auVar212._0_4_ + fVar273 * auVar14._0_4_ + auVar213._0_4_ * fVar309;
  auVar193._4_4_ = fVar314 * auVar212._4_4_ + fVar243 * auVar14._4_4_ + auVar213._4_4_ * fVar310;
  auVar193._8_4_ = fVar255 * auVar212._8_4_ + fVar277 * auVar14._8_4_ + auVar213._8_4_ * fVar311;
  auVar193._12_4_ = fVar223 * auVar212._12_4_ + fVar245 * auVar14._12_4_ + auVar213._12_4_ * fVar312
  ;
  auVar193._16_4_ = fVar313 * auVar212._16_4_ + fVar273 * auVar14._16_4_ + auVar213._16_4_ * fVar309
  ;
  auVar193._20_4_ = fVar314 * auVar212._20_4_ + fVar243 * auVar14._20_4_ + auVar213._20_4_ * fVar310
  ;
  auVar193._24_4_ = fVar255 * auVar212._24_4_ + fVar277 * auVar14._24_4_ + auVar213._24_4_ * fVar311
  ;
  auVar193._28_4_ = fVar298 + auVar12._28_4_ + fVar312;
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar265._16_4_ = 0x7fffffff;
  auVar265._20_4_ = 0x7fffffff;
  auVar265._24_4_ = 0x7fffffff;
  auVar265._28_4_ = 0x7fffffff;
  auVar302._8_4_ = 0x219392ef;
  auVar302._0_8_ = 0x219392ef219392ef;
  auVar302._12_4_ = 0x219392ef;
  auVar302._16_4_ = 0x219392ef;
  auVar302._20_4_ = 0x219392ef;
  auVar302._24_4_ = 0x219392ef;
  auVar302._28_4_ = 0x219392ef;
  auVar95 = vandps_avx(auVar354,auVar265);
  auVar95 = vcmpps_avx(auVar95,auVar302,1);
  auVar107 = vblendvps_avx(auVar354,auVar302,auVar95);
  auVar95 = vandps_avx(auVar339,auVar265);
  auVar95 = vcmpps_avx(auVar95,auVar302,1);
  auVar10 = vblendvps_avx(auVar339,auVar302,auVar95);
  auVar95 = vandps_avx(auVar232,auVar265);
  auVar95 = vcmpps_avx(auVar95,auVar302,1);
  auVar95 = vblendvps_avx(auVar232,auVar302,auVar95);
  auVar11 = vrcpps_avx(auVar107);
  fVar298 = auVar11._0_4_;
  fVar309 = auVar11._4_4_;
  auVar12._4_4_ = auVar107._4_4_ * fVar309;
  auVar12._0_4_ = auVar107._0_4_ * fVar298;
  fVar310 = auVar11._8_4_;
  auVar12._8_4_ = auVar107._8_4_ * fVar310;
  fVar311 = auVar11._12_4_;
  auVar12._12_4_ = auVar107._12_4_ * fVar311;
  fVar312 = auVar11._16_4_;
  auVar12._16_4_ = auVar107._16_4_ * fVar312;
  fVar313 = auVar11._20_4_;
  auVar12._20_4_ = auVar107._20_4_ * fVar313;
  fVar314 = auVar11._24_4_;
  auVar12._24_4_ = auVar107._24_4_ * fVar314;
  auVar12._28_4_ = auVar107._28_4_;
  auVar316._8_4_ = 0x3f800000;
  auVar316._0_8_ = 0x3f8000003f800000;
  auVar316._12_4_ = 0x3f800000;
  auVar316._16_4_ = 0x3f800000;
  auVar316._20_4_ = 0x3f800000;
  auVar316._24_4_ = 0x3f800000;
  auVar316._28_4_ = 0x3f800000;
  auVar107 = vsubps_avx(auVar316,auVar12);
  fVar298 = fVar298 + fVar298 * auVar107._0_4_;
  fVar309 = fVar309 + fVar309 * auVar107._4_4_;
  fVar310 = fVar310 + fVar310 * auVar107._8_4_;
  fVar311 = fVar311 + fVar311 * auVar107._12_4_;
  fVar312 = fVar312 + fVar312 * auVar107._16_4_;
  fVar313 = fVar313 + fVar313 * auVar107._20_4_;
  fVar314 = fVar314 + fVar314 * auVar107._24_4_;
  auVar107 = vrcpps_avx(auVar10);
  fVar255 = auVar107._0_4_;
  fVar273 = auVar107._4_4_;
  auVar11._4_4_ = fVar273 * auVar10._4_4_;
  auVar11._0_4_ = fVar255 * auVar10._0_4_;
  fVar277 = auVar107._8_4_;
  auVar11._8_4_ = fVar277 * auVar10._8_4_;
  fVar281 = auVar107._12_4_;
  auVar11._12_4_ = fVar281 * auVar10._12_4_;
  fVar285 = auVar107._16_4_;
  auVar11._16_4_ = fVar285 * auVar10._16_4_;
  fVar289 = auVar107._20_4_;
  auVar11._20_4_ = fVar289 * auVar10._20_4_;
  fVar293 = auVar107._24_4_;
  auVar11._24_4_ = fVar293 * auVar10._24_4_;
  auVar11._28_4_ = auVar10._28_4_;
  auVar10 = vsubps_avx(auVar316,auVar11);
  fVar255 = fVar255 + fVar255 * auVar10._0_4_;
  fVar273 = fVar273 + fVar273 * auVar10._4_4_;
  fVar277 = fVar277 + fVar277 * auVar10._8_4_;
  fVar281 = fVar281 + fVar281 * auVar10._12_4_;
  fVar285 = fVar285 + fVar285 * auVar10._16_4_;
  fVar289 = fVar289 + fVar289 * auVar10._20_4_;
  fVar293 = fVar293 + fVar293 * auVar10._24_4_;
  auVar107 = vrcpps_avx(auVar95);
  fVar223 = auVar107._0_4_;
  fVar243 = auVar107._4_4_;
  auVar13._4_4_ = fVar243 * auVar95._4_4_;
  auVar13._0_4_ = fVar223 * auVar95._0_4_;
  fVar245 = auVar107._8_4_;
  auVar13._8_4_ = fVar245 * auVar95._8_4_;
  fVar247 = auVar107._12_4_;
  auVar13._12_4_ = fVar247 * auVar95._12_4_;
  fVar249 = auVar107._16_4_;
  auVar13._16_4_ = fVar249 * auVar95._16_4_;
  fVar251 = auVar107._20_4_;
  auVar13._20_4_ = fVar251 * auVar95._20_4_;
  fVar253 = auVar107._24_4_;
  auVar13._24_4_ = fVar253 * auVar95._24_4_;
  auVar13._28_4_ = auVar10._28_4_;
  auVar95 = vsubps_avx(auVar316,auVar13);
  fVar223 = fVar223 + fVar223 * auVar95._0_4_;
  fVar243 = fVar243 + fVar243 * auVar95._4_4_;
  fVar245 = fVar245 + fVar245 * auVar95._8_4_;
  fVar247 = fVar247 + fVar247 * auVar95._12_4_;
  fVar249 = fVar249 + fVar249 * auVar95._16_4_;
  fVar251 = fVar251 + fVar251 * auVar95._20_4_;
  fVar253 = fVar253 + fVar253 * auVar95._24_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + uVar79 * 7 + 0xe);
  auVar125 = vpmovsxwd_avx(auVar125);
  auVar96._16_16_ = auVar125;
  auVar96._0_16_ = auVar15;
  auVar95 = vcvtdq2ps_avx(auVar96);
  auVar95 = vsubps_avx(auVar95,auVar139);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar79 * 9 + 0xe);
  auVar125 = vpmovsxwd_avx(auVar2);
  auVar84._0_4_ = fVar298 * auVar95._0_4_;
  auVar84._4_4_ = fVar309 * auVar95._4_4_;
  auVar84._8_4_ = fVar310 * auVar95._8_4_;
  auVar84._12_4_ = fVar311 * auVar95._12_4_;
  auVar10._16_4_ = fVar312 * auVar95._16_4_;
  auVar10._0_16_ = auVar84;
  auVar10._20_4_ = fVar313 * auVar95._20_4_;
  auVar10._24_4_ = fVar314 * auVar95._24_4_;
  auVar10._28_4_ = auVar95._28_4_;
  auVar162._16_16_ = auVar125;
  auVar162._0_16_ = auVar15;
  auVar95 = vcvtdq2ps_avx(auVar162);
  auVar95 = vsubps_avx(auVar95,auVar139);
  auVar124._0_4_ = fVar298 * auVar95._0_4_;
  auVar124._4_4_ = fVar309 * auVar95._4_4_;
  auVar124._8_4_ = fVar310 * auVar95._8_4_;
  auVar124._12_4_ = fVar311 * auVar95._12_4_;
  auVar212._16_4_ = fVar312 * auVar95._16_4_;
  auVar212._0_16_ = auVar124;
  auVar212._20_4_ = fVar313 * auVar95._20_4_;
  auVar212._24_4_ = fVar314 * auVar95._24_4_;
  auVar212._28_4_ = auVar95._28_4_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar79 * 0xe + 6);
  auVar15 = vpmovsxwd_avx(auVar181);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar79 * 0xe + 0xe);
  auVar125 = vpmovsxwd_avx(auVar3);
  auVar163._16_16_ = auVar125;
  auVar163._0_16_ = auVar15;
  auVar95 = vcvtdq2ps_avx(auVar163);
  auVar95 = vsubps_avx(auVar95,auVar210);
  auVar93._0_4_ = fVar255 * auVar95._0_4_;
  auVar93._4_4_ = fVar273 * auVar95._4_4_;
  auVar93._8_4_ = fVar277 * auVar95._8_4_;
  auVar93._12_4_ = fVar281 * auVar95._12_4_;
  auVar14._16_4_ = fVar285 * auVar95._16_4_;
  auVar14._0_16_ = auVar93;
  auVar14._20_4_ = fVar289 * auVar95._20_4_;
  auVar14._24_4_ = fVar293 * auVar95._24_4_;
  auVar14._28_4_ = auVar95._28_4_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar260);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 0xe);
  auVar125 = vpmovsxwd_avx(auVar4);
  auVar303._16_16_ = auVar125;
  auVar303._0_16_ = auVar15;
  auVar95 = vcvtdq2ps_avx(auVar303);
  auVar95 = vsubps_avx(auVar95,auVar210);
  auVar199._0_4_ = fVar255 * auVar95._0_4_;
  auVar199._4_4_ = fVar273 * auVar95._4_4_;
  auVar199._8_4_ = fVar277 * auVar95._8_4_;
  auVar199._12_4_ = fVar281 * auVar95._12_4_;
  auVar213._16_4_ = fVar285 * auVar95._16_4_;
  auVar213._0_16_ = auVar199;
  auVar213._20_4_ = fVar289 * auVar95._20_4_;
  auVar213._24_4_ = fVar293 * auVar95._24_4_;
  auVar213._28_4_ = auVar95._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar79 * 0x15 + 6);
  auVar15 = vpmovsxwd_avx(auVar5);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar79 * 0x15 + 0xe);
  auVar125 = vpmovsxwd_avx(auVar184);
  auVar266._16_16_ = auVar125;
  auVar266._0_16_ = auVar15;
  auVar95 = vcvtdq2ps_avx(auVar266);
  auVar95 = vsubps_avx(auVar95,auVar193);
  auVar259._0_4_ = fVar223 * auVar95._0_4_;
  auVar259._4_4_ = fVar243 * auVar95._4_4_;
  auVar259._8_4_ = fVar245 * auVar95._8_4_;
  auVar259._12_4_ = fVar247 * auVar95._12_4_;
  auVar19._16_4_ = fVar249 * auVar95._16_4_;
  auVar19._0_16_ = auVar259;
  auVar19._20_4_ = fVar251 * auVar95._20_4_;
  auVar19._24_4_ = fVar253 * auVar95._24_4_;
  auVar19._28_4_ = auVar95._28_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar15 = vpmovsxwd_avx(auVar87);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 0xe);
  auVar125 = vpmovsxwd_avx(auVar156);
  auVar304._16_16_ = auVar125;
  auVar304._0_16_ = auVar15;
  auVar95 = vcvtdq2ps_avx(auVar304);
  auVar95 = vsubps_avx(auVar95,auVar193);
  auVar89._0_4_ = fVar223 * auVar95._0_4_;
  auVar89._4_4_ = fVar243 * auVar95._4_4_;
  auVar89._8_4_ = fVar245 * auVar95._8_4_;
  auVar89._12_4_ = fVar247 * auVar95._12_4_;
  auVar20._16_4_ = fVar249 * auVar95._16_4_;
  auVar20._0_16_ = auVar89;
  auVar20._20_4_ = fVar251 * auVar95._20_4_;
  auVar20._24_4_ = fVar253 * auVar95._24_4_;
  auVar20._28_4_ = auVar95._28_4_;
  auVar15 = vpminsd_avx(auVar10._16_16_,auVar212._16_16_);
  auVar125 = vpminsd_avx(auVar84,auVar124);
  auVar317._16_16_ = auVar15;
  auVar317._0_16_ = auVar125;
  auVar15 = vpminsd_avx(auVar14._16_16_,auVar213._16_16_);
  auVar125 = vpminsd_avx(auVar93,auVar199);
  auVar324._16_16_ = auVar15;
  auVar324._0_16_ = auVar125;
  auVar95 = vmaxps_avx(auVar317,auVar324);
  auVar15 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar125 = vpminsd_avx(auVar259,auVar89);
  auVar368._16_16_ = auVar15;
  auVar368._0_16_ = auVar125;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar384._4_4_ = uVar1;
  auVar384._0_4_ = uVar1;
  auVar384._8_4_ = uVar1;
  auVar384._12_4_ = uVar1;
  auVar384._16_4_ = uVar1;
  auVar384._20_4_ = uVar1;
  auVar384._24_4_ = uVar1;
  auVar384._28_4_ = uVar1;
  auVar107 = vmaxps_avx(auVar368,auVar384);
  auVar95 = vmaxps_avx(auVar95,auVar107);
  local_400._4_4_ = auVar95._4_4_ * 0.99999964;
  local_400._0_4_ = auVar95._0_4_ * 0.99999964;
  local_400._8_4_ = auVar95._8_4_ * 0.99999964;
  local_400._12_4_ = auVar95._12_4_ * 0.99999964;
  local_400._16_4_ = auVar95._16_4_ * 0.99999964;
  local_400._20_4_ = auVar95._20_4_ * 0.99999964;
  local_400._24_4_ = auVar95._24_4_ * 0.99999964;
  local_400._28_4_ = auVar95._28_4_;
  auVar15 = vpmaxsd_avx(auVar10._16_16_,auVar212._16_16_);
  auVar125 = vpmaxsd_avx(auVar84,auVar124);
  auVar97._16_16_ = auVar15;
  auVar97._0_16_ = auVar125;
  auVar15 = vpmaxsd_avx(auVar14._16_16_,auVar213._16_16_);
  auVar125 = vpmaxsd_avx(auVar93,auVar199);
  auVar140._16_16_ = auVar15;
  auVar140._0_16_ = auVar125;
  auVar95 = vminps_avx(auVar97,auVar140);
  auVar15 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar125 = vpmaxsd_avx(auVar259,auVar89);
  auVar141._16_16_ = auVar15;
  auVar141._0_16_ = auVar125;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar164._4_4_ = uVar1;
  auVar164._0_4_ = uVar1;
  auVar164._8_4_ = uVar1;
  auVar164._12_4_ = uVar1;
  auVar164._16_4_ = uVar1;
  auVar164._20_4_ = uVar1;
  auVar164._24_4_ = uVar1;
  auVar164._28_4_ = uVar1;
  auVar107 = vminps_avx(auVar141,auVar164);
  auVar95 = vminps_avx(auVar95,auVar107);
  auVar107._4_4_ = auVar95._4_4_ * 1.0000004;
  auVar107._0_4_ = auVar95._0_4_ * 1.0000004;
  auVar107._8_4_ = auVar95._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar95._12_4_ * 1.0000004;
  auVar107._16_4_ = auVar95._16_4_ * 1.0000004;
  auVar107._20_4_ = auVar95._20_4_ * 1.0000004;
  auVar107._24_4_ = auVar95._24_4_ * 1.0000004;
  auVar107._28_4_ = auVar95._28_4_;
  auVar95 = vcmpps_avx(local_400,auVar107,2);
  auVar15 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar142._16_16_ = auVar15;
  auVar142._0_16_ = auVar15;
  auVar107 = vcvtdq2ps_avx(auVar142);
  auVar107 = vcmpps_avx(_DAT_01f7b060,auVar107,1);
  auVar95 = vandps_avx(auVar95,auVar107);
  uVar73 = vmovmskps_avx(auVar95);
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  local_a88 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8c8 = prim;
LAB_00977eb8:
  uVar79 = (ulong)uVar73;
  if (uVar79 == 0) {
    return;
  }
  lVar75 = 0;
  if (uVar79 != 0) {
    for (; (uVar73 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
    }
  }
  uVar79 = uVar79 - 1 & uVar79;
  local_8c0 = *(uint *)(local_8c8 + lVar75 * 4 + 6);
  lVar75 = lVar75 * 0x40;
  lVar9 = 0;
  if (uVar79 != 0) {
    for (; (uVar79 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar73 = *(uint *)(local_8c8 + 2);
  auVar15 = *(undefined1 (*) [16])(local_8d0 + lVar75);
  if (((uVar79 != 0) && (uVar78 = uVar79 - 1 & uVar79, uVar78 != 0)) && (lVar9 = 0, uVar78 != 0)) {
    for (; (uVar78 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar125 = *(undefined1 (*) [16])(local_8d0 + lVar75 + 0x10);
  auVar18 = *(undefined1 (*) [16])(local_8d0 + lVar75 + 0x20);
  auVar2 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar2,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar298 = *(float *)(ray + k * 4 + 0x40);
  auVar353._4_4_ = fVar298;
  auVar353._0_4_ = fVar298;
  auVar353._8_4_ = fVar298;
  auVar353._12_4_ = fVar298;
  fStack_a70 = fVar298;
  _local_a80 = auVar353;
  fStack_a6c = fVar298;
  fStack_a68 = fVar298;
  fStack_a64 = fVar298;
  auVar2 = *(undefined1 (*) [16])(local_8d0 + lVar75 + 0x30);
  fVar309 = *(float *)(ray + k * 4 + 0x50);
  auVar367._4_4_ = fVar309;
  auVar367._0_4_ = fVar309;
  auVar367._8_4_ = fVar309;
  auVar367._12_4_ = fVar309;
  fStack_6d0 = fVar309;
  _local_6e0 = auVar367;
  fStack_6cc = fVar309;
  fStack_6c8 = fVar309;
  fStack_6c4 = fVar309;
  auVar181 = vunpcklps_avx(auVar353,auVar367);
  fVar310 = *(float *)(ray + k * 4 + 0x60);
  auVar383._4_4_ = fVar310;
  auVar383._0_4_ = fVar310;
  auVar383._8_4_ = fVar310;
  auVar383._12_4_ = fVar310;
  fStack_870 = fVar310;
  _local_880 = auVar383;
  fStack_86c = fVar310;
  fStack_868 = fVar310;
  fStack_864 = fVar310;
  _local_9f0 = vinsertps_avx(auVar181,auVar383,0x28);
  auVar85._0_4_ = (auVar15._0_4_ + auVar125._0_4_ + auVar18._0_4_ + auVar2._0_4_) * 0.25;
  auVar85._4_4_ = (auVar15._4_4_ + auVar125._4_4_ + auVar18._4_4_ + auVar2._4_4_) * 0.25;
  auVar85._8_4_ = (auVar15._8_4_ + auVar125._8_4_ + auVar18._8_4_ + auVar2._8_4_) * 0.25;
  auVar85._12_4_ = (auVar15._12_4_ + auVar125._12_4_ + auVar18._12_4_ + auVar2._12_4_) * 0.25;
  auVar181 = vsubps_avx(auVar85,auVar3);
  auVar181 = vdpps_avx(auVar181,_local_9f0,0x7f);
  local_a00 = vdpps_avx(_local_9f0,_local_9f0,0x7f);
  auVar260 = vrcpss_avx(local_a00,local_a00);
  fVar311 = auVar181._0_4_ * auVar260._0_4_ * (2.0 - local_a00._0_4_ * auVar260._0_4_);
  auVar260 = vshufps_avx(ZEXT416((uint)fVar311),ZEXT416((uint)fVar311),0);
  auVar200._0_4_ = auVar3._0_4_ + local_9f0._0_4_ * auVar260._0_4_;
  auVar200._4_4_ = auVar3._4_4_ + local_9f0._4_4_ * auVar260._4_4_;
  auVar200._8_4_ = auVar3._8_4_ + local_9f0._8_4_ * auVar260._8_4_;
  auVar200._12_4_ = auVar3._12_4_ + local_9f0._12_4_ * auVar260._12_4_;
  auVar181 = vblendps_avx(auVar200,_DAT_01f45a50,8);
  auVar3 = vsubps_avx(auVar15,auVar181);
  auVar4 = vsubps_avx(auVar18,auVar181);
  auVar5 = vsubps_avx(auVar125,auVar181);
  auVar2 = vsubps_avx(auVar2,auVar181);
  auVar15 = vshufps_avx(auVar3,auVar3,0);
  register0x00001250 = auVar15;
  _local_1e0 = auVar15;
  auVar15 = vshufps_avx(auVar3,auVar3,0x55);
  local_a20._16_16_ = auVar15;
  local_a20._0_16_ = auVar15;
  auVar15 = vshufps_avx(auVar3,auVar3,0xaa);
  local_380._16_16_ = auVar15;
  local_380._0_16_ = auVar15;
  auVar15 = vshufps_avx(auVar3,auVar3,0xff);
  auVar125 = vshufps_avx(auVar5,auVar5,0);
  auVar267._16_16_ = auVar125;
  auVar267._0_16_ = auVar125;
  auVar125 = vshufps_avx(auVar5,auVar5,0x55);
  local_960._16_16_ = auVar125;
  local_960._0_16_ = auVar125;
  auVar125 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar344._16_16_ = auVar125;
  auVar344._0_16_ = auVar125;
  auVar125 = vshufps_avx(auVar5,auVar5,0xff);
  local_9a0._16_16_ = auVar125;
  local_9a0._0_16_ = auVar125;
  auVar125 = vshufps_avx(auVar4,auVar4,0);
  local_3a0._16_16_ = auVar125;
  local_3a0._0_16_ = auVar125;
  auVar125 = vshufps_avx(auVar4,auVar4,0x55);
  local_3c0._16_16_ = auVar125;
  local_3c0._0_16_ = auVar125;
  auVar125 = vshufps_avx(auVar4,auVar4,0xaa);
  register0x00001290 = auVar125;
  _local_200 = auVar125;
  auVar125 = vshufps_avx(auVar4,auVar4,0xff);
  register0x00001290 = auVar125;
  _local_220 = auVar125;
  auVar125 = vshufps_avx(auVar2,auVar2,0);
  register0x00001290 = auVar125;
  _local_240 = auVar125;
  auVar125 = vshufps_avx(auVar2,auVar2,0x55);
  register0x00001290 = auVar125;
  _local_260 = auVar125;
  auVar125 = vshufps_avx(auVar2,auVar2,0xaa);
  register0x00001290 = auVar125;
  _local_280 = auVar125;
  auVar125 = vshufps_avx(auVar2,auVar2,0xff);
  register0x00001290 = auVar125;
  _local_2a0 = auVar125;
  auVar125 = ZEXT416((uint)(fVar298 * fVar298 + fVar309 * fVar309 + fVar310 * fVar310));
  auVar125 = vshufps_avx(auVar125,auVar125,0);
  local_2c0._16_16_ = auVar125;
  local_2c0._0_16_ = auVar125;
  fVar298 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar311);
  auVar386 = ZEXT3264(local_960);
  auVar125 = vshufps_avx(ZEXT416((uint)(fVar298 - fVar311)),ZEXT416((uint)(fVar298 - fVar311)),0);
  local_3e0._16_16_ = auVar125;
  local_3e0._0_16_ = auVar125;
  local_7b0 = vpshufd_avx(ZEXT416(uVar73),0);
  local_7c0 = vpshufd_avx(ZEXT416(local_8c0),0);
  register0x00001210 = auVar260;
  _local_8a0 = auVar260;
  uVar78 = 0;
  local_ca8 = 1;
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  local_5c0 = vandps_avx(local_2c0,auVar99);
  auVar125 = vsqrtss_avx(local_a00,local_a00);
  auVar18 = vsqrtss_avx(local_a00,local_a00);
  auVar331 = ZEXT3264(local_a20);
  auVar272 = ZEXT3264(local_9a0);
  local_610 = ZEXT816(0x3f80000000000000);
  local_5a0 = auVar267;
  local_b00 = auVar344;
  do {
    auVar194._8_4_ = 0x3f800000;
    auVar194._0_8_ = 0x3f8000003f800000;
    auVar194._12_4_ = 0x3f800000;
    auVar194._16_4_ = 0x3f800000;
    auVar194._20_4_ = 0x3f800000;
    auVar194._24_4_ = 0x3f800000;
    auVar194._28_4_ = 0x3f800000;
    auVar181 = vmovshdup_avx(local_610);
    auVar184 = vsubps_avx(auVar181,local_610);
    auVar181 = vshufps_avx(local_610,local_610,0);
    auVar260 = vshufps_avx(auVar184,auVar184,0);
    fVar122 = auVar260._0_4_;
    fVar153 = auVar260._4_4_;
    fVar154 = auVar260._8_4_;
    fVar155 = auVar260._12_4_;
    fVar82 = auVar181._0_4_;
    auVar143._0_4_ = fVar82 + fVar122 * 0.0;
    fVar113 = auVar181._4_4_;
    auVar143._4_4_ = fVar113 + fVar153 * 0.14285715;
    fVar115 = auVar181._8_4_;
    auVar143._8_4_ = fVar115 + fVar154 * 0.2857143;
    fVar117 = auVar181._12_4_;
    auVar143._12_4_ = fVar117 + fVar155 * 0.42857146;
    auVar143._16_4_ = fVar82 + fVar122 * 0.5714286;
    auVar143._20_4_ = fVar113 + fVar153 * 0.71428573;
    auVar143._24_4_ = fVar115 + fVar154 * 0.8571429;
    auVar143._28_4_ = fVar117 + fVar155;
    auVar95 = vsubps_avx(auVar194,auVar143);
    fVar309 = auVar267._28_4_;
    fVar311 = auVar95._0_4_;
    fVar312 = auVar95._4_4_;
    fVar313 = auVar95._8_4_;
    fVar314 = auVar95._12_4_;
    fVar255 = auVar95._16_4_;
    fVar223 = auVar95._20_4_;
    fVar273 = auVar95._24_4_;
    fVar289 = auVar272._28_4_ + fVar309 + auVar344._28_4_ + 1.0 + 1.0;
    fVar310 = local_380._28_4_;
    fVar256 = local_3a0._0_4_ * auVar143._0_4_ + auVar267._0_4_ * fVar311;
    fVar274 = local_3a0._4_4_ * auVar143._4_4_ + auVar267._4_4_ * fVar312;
    fVar278 = local_3a0._8_4_ * auVar143._8_4_ + auVar267._8_4_ * fVar313;
    fVar282 = local_3a0._12_4_ * auVar143._12_4_ + auVar267._12_4_ * fVar314;
    fVar286 = local_3a0._16_4_ * auVar143._16_4_ + auVar267._16_4_ * fVar255;
    fVar290 = local_3a0._20_4_ * auVar143._20_4_ + auVar267._20_4_ * fVar223;
    fVar294 = local_3a0._24_4_ * auVar143._24_4_ + auVar267._24_4_ * fVar273;
    fVar243 = local_3c0._0_4_ * auVar143._0_4_ + auVar386._0_4_ * fVar311;
    fVar277 = local_3c0._4_4_ * auVar143._4_4_ + auVar386._4_4_ * fVar312;
    fVar245 = local_3c0._8_4_ * auVar143._8_4_ + auVar386._8_4_ * fVar313;
    fVar281 = local_3c0._12_4_ * auVar143._12_4_ + auVar386._12_4_ * fVar314;
    fVar247 = local_3c0._16_4_ * auVar143._16_4_ + auVar386._16_4_ * fVar255;
    fVar285 = local_3c0._20_4_ * auVar143._20_4_ + auVar386._20_4_ * fVar223;
    fVar249 = local_3c0._24_4_ * auVar143._24_4_ + auVar386._24_4_ * fVar273;
    fVar251 = (float)local_200._0_4_ * auVar143._0_4_ + auVar344._0_4_ * fVar311;
    fVar293 = (float)local_200._4_4_ * auVar143._4_4_ + auVar344._4_4_ * fVar312;
    fVar253 = fStack_1f8 * auVar143._8_4_ + auVar344._8_4_ * fVar313;
    fVar219 = fStack_1f4 * auVar143._12_4_ + auVar344._12_4_ * fVar314;
    fVar220 = fStack_1f0 * auVar143._16_4_ + auVar344._16_4_ * fVar255;
    fVar221 = fStack_1ec * auVar143._20_4_ + auVar344._20_4_ * fVar223;
    fVar222 = fStack_1e8 * auVar143._24_4_ + auVar344._24_4_ * fVar273;
    fVar224 = (float)local_220._0_4_ * auVar143._0_4_ + auVar272._0_4_ * fVar311;
    fVar244 = (float)local_220._4_4_ * auVar143._4_4_ + auVar272._4_4_ * fVar312;
    fVar246 = fStack_218 * auVar143._8_4_ + auVar272._8_4_ * fVar313;
    fVar248 = fStack_214 * auVar143._12_4_ + auVar272._12_4_ * fVar314;
    fVar250 = fStack_210 * auVar143._16_4_ + auVar272._16_4_ * fVar255;
    fVar252 = fStack_20c * auVar143._20_4_ + auVar272._20_4_ * fVar223;
    fVar254 = fStack_208 * auVar143._24_4_ + auVar272._24_4_ * fVar273;
    fVar382 = fVar310 + fVar309;
    fVar364 = auVar15._12_4_ + fVar310;
    auVar318._0_4_ =
         fVar311 * (auVar267._0_4_ * auVar143._0_4_ + fVar311 * (float)local_1e0._0_4_) +
         auVar143._0_4_ * fVar256;
    auVar318._4_4_ =
         fVar312 * (auVar267._4_4_ * auVar143._4_4_ + fVar312 * (float)local_1e0._4_4_) +
         auVar143._4_4_ * fVar274;
    auVar318._8_4_ =
         fVar313 * (auVar267._8_4_ * auVar143._8_4_ + fVar313 * fStack_1d8) +
         auVar143._8_4_ * fVar278;
    auVar318._12_4_ =
         fVar314 * (auVar267._12_4_ * auVar143._12_4_ + fVar314 * fStack_1d4) +
         auVar143._12_4_ * fVar282;
    auVar318._16_4_ =
         fVar255 * (auVar267._16_4_ * auVar143._16_4_ + fVar255 * fStack_1d0) +
         auVar143._16_4_ * fVar286;
    auVar318._20_4_ =
         fVar223 * (auVar267._20_4_ * auVar143._20_4_ + fVar223 * fStack_1cc) +
         auVar143._20_4_ * fVar290;
    auVar318._24_4_ =
         fVar273 * (auVar267._24_4_ * auVar143._24_4_ + fVar273 * fStack_1c8) +
         auVar143._24_4_ * fVar294;
    auVar318._28_4_ = local_3a0._28_4_ + fVar310;
    auVar329._0_4_ =
         fVar311 * (auVar386._0_4_ * auVar143._0_4_ + auVar331._0_4_ * fVar311) +
         auVar143._0_4_ * fVar243;
    auVar329._4_4_ =
         fVar312 * (auVar386._4_4_ * auVar143._4_4_ + auVar331._4_4_ * fVar312) +
         auVar143._4_4_ * fVar277;
    auVar329._8_4_ =
         fVar313 * (auVar386._8_4_ * auVar143._8_4_ + auVar331._8_4_ * fVar313) +
         auVar143._8_4_ * fVar245;
    auVar329._12_4_ =
         fVar314 * (auVar386._12_4_ * auVar143._12_4_ + auVar331._12_4_ * fVar314) +
         auVar143._12_4_ * fVar281;
    auVar329._16_4_ =
         fVar255 * (auVar386._16_4_ * auVar143._16_4_ + auVar331._16_4_ * fVar255) +
         auVar143._16_4_ * fVar247;
    auVar329._20_4_ =
         fVar223 * (auVar386._20_4_ * auVar143._20_4_ + auVar331._20_4_ * fVar223) +
         auVar143._20_4_ * fVar285;
    auVar329._24_4_ =
         fVar273 * (auVar386._24_4_ * auVar143._24_4_ + auVar331._24_4_ * fVar273) +
         auVar143._24_4_ * fVar249;
    auVar329._28_4_ = local_3c0._28_4_ + fVar310;
    auVar340._0_4_ =
         fVar311 * (auVar344._0_4_ * auVar143._0_4_ + local_380._0_4_ * fVar311) +
         auVar143._0_4_ * fVar251;
    auVar340._4_4_ =
         fVar312 * (auVar344._4_4_ * auVar143._4_4_ + local_380._4_4_ * fVar312) +
         auVar143._4_4_ * fVar293;
    auVar340._8_4_ =
         fVar313 * (auVar344._8_4_ * auVar143._8_4_ + local_380._8_4_ * fVar313) +
         auVar143._8_4_ * fVar253;
    auVar340._12_4_ =
         fVar314 * (auVar344._12_4_ * auVar143._12_4_ + local_380._12_4_ * fVar314) +
         auVar143._12_4_ * fVar219;
    auVar340._16_4_ =
         fVar255 * (auVar344._16_4_ * auVar143._16_4_ + local_380._16_4_ * fVar255) +
         auVar143._16_4_ * fVar220;
    auVar340._20_4_ =
         fVar223 * (auVar344._20_4_ * auVar143._20_4_ + local_380._20_4_ * fVar223) +
         auVar143._20_4_ * fVar221;
    auVar340._24_4_ =
         fVar273 * (auVar344._24_4_ * auVar143._24_4_ + local_380._24_4_ * fVar273) +
         auVar143._24_4_ * fVar222;
    auVar340._28_4_ = fStack_1e4 + fVar310;
    auVar305._0_4_ =
         auVar143._0_4_ * fVar224 +
         fVar311 * (auVar272._0_4_ * auVar143._0_4_ + auVar15._0_4_ * fVar311);
    auVar305._4_4_ =
         auVar143._4_4_ * fVar244 +
         fVar312 * (auVar272._4_4_ * auVar143._4_4_ + auVar15._4_4_ * fVar312);
    auVar305._8_4_ =
         auVar143._8_4_ * fVar246 +
         fVar313 * (auVar272._8_4_ * auVar143._8_4_ + auVar15._8_4_ * fVar313);
    auVar305._12_4_ =
         auVar143._12_4_ * fVar248 +
         fVar314 * (auVar272._12_4_ * auVar143._12_4_ + auVar15._12_4_ * fVar314);
    auVar305._16_4_ =
         auVar143._16_4_ * fVar250 +
         fVar255 * (auVar272._16_4_ * auVar143._16_4_ + auVar15._0_4_ * fVar255);
    auVar305._20_4_ =
         auVar143._20_4_ * fVar252 +
         fVar223 * (auVar272._20_4_ * auVar143._20_4_ + auVar15._4_4_ * fVar223);
    auVar305._24_4_ =
         auVar143._24_4_ * fVar254 +
         fVar273 * (auVar272._24_4_ * auVar143._24_4_ + auVar15._8_4_ * fVar273);
    auVar305._28_4_ = fStack_1e4 + fStack_204;
    auVar100._0_4_ =
         (auVar143._0_4_ * (float)local_240._0_4_ + local_3a0._0_4_ * fVar311) * auVar143._0_4_ +
         fVar311 * fVar256;
    auVar100._4_4_ =
         (auVar143._4_4_ * (float)local_240._4_4_ + local_3a0._4_4_ * fVar312) * auVar143._4_4_ +
         fVar312 * fVar274;
    auVar100._8_4_ =
         (auVar143._8_4_ * fStack_238 + local_3a0._8_4_ * fVar313) * auVar143._8_4_ +
         fVar313 * fVar278;
    auVar100._12_4_ =
         (auVar143._12_4_ * fStack_234 + local_3a0._12_4_ * fVar314) * auVar143._12_4_ +
         fVar314 * fVar282;
    auVar100._16_4_ =
         (auVar143._16_4_ * fStack_230 + local_3a0._16_4_ * fVar255) * auVar143._16_4_ +
         fVar255 * fVar286;
    auVar100._20_4_ =
         (auVar143._20_4_ * fStack_22c + local_3a0._20_4_ * fVar223) * auVar143._20_4_ +
         fVar223 * fVar290;
    auVar100._24_4_ =
         (auVar143._24_4_ * fStack_228 + local_3a0._24_4_ * fVar273) * auVar143._24_4_ +
         fVar273 * fVar294;
    auVar100._28_4_ = fStack_1e4 + fVar289 + auVar272._28_4_;
    auVar195._0_4_ =
         (auVar143._0_4_ * (float)local_260._0_4_ + local_3c0._0_4_ * fVar311) * auVar143._0_4_ +
         fVar311 * fVar243;
    auVar195._4_4_ =
         (auVar143._4_4_ * (float)local_260._4_4_ + local_3c0._4_4_ * fVar312) * auVar143._4_4_ +
         fVar312 * fVar277;
    auVar195._8_4_ =
         (auVar143._8_4_ * fStack_258 + local_3c0._8_4_ * fVar313) * auVar143._8_4_ +
         fVar313 * fVar245;
    auVar195._12_4_ =
         (auVar143._12_4_ * fStack_254 + local_3c0._12_4_ * fVar314) * auVar143._12_4_ +
         fVar314 * fVar281;
    auVar195._16_4_ =
         (auVar143._16_4_ * fStack_250 + local_3c0._16_4_ * fVar255) * auVar143._16_4_ +
         fVar255 * fVar247;
    auVar195._20_4_ =
         (auVar143._20_4_ * fStack_24c + local_3c0._20_4_ * fVar223) * auVar143._20_4_ +
         fVar223 * fVar285;
    auVar195._24_4_ =
         (auVar143._24_4_ * fStack_248 + local_3c0._24_4_ * fVar273) * auVar143._24_4_ +
         fVar273 * fVar249;
    auVar195._28_4_ = fStack_1e4 + fVar289 + 1.0;
    auVar211._0_4_ =
         (auVar143._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar311) *
         auVar143._0_4_ + fVar311 * fVar251;
    auVar211._4_4_ =
         (auVar143._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar312) *
         auVar143._4_4_ + fVar312 * fVar293;
    auVar211._8_4_ =
         (auVar143._8_4_ * fStack_278 + fStack_1f8 * fVar313) * auVar143._8_4_ + fVar313 * fVar253;
    auVar211._12_4_ =
         (auVar143._12_4_ * fStack_274 + fStack_1f4 * fVar314) * auVar143._12_4_ + fVar314 * fVar219
    ;
    auVar211._16_4_ =
         (auVar143._16_4_ * fStack_270 + fStack_1f0 * fVar255) * auVar143._16_4_ + fVar255 * fVar220
    ;
    auVar211._20_4_ =
         (auVar143._20_4_ * fStack_26c + fStack_1ec * fVar223) * auVar143._20_4_ + fVar223 * fVar221
    ;
    auVar211._24_4_ =
         (auVar143._24_4_ * fStack_268 + fStack_1e8 * fVar273) * auVar143._24_4_ + fVar273 * fVar222
    ;
    auVar211._28_4_ = fVar364 + fVar309 + 1.0;
    auVar233._0_4_ =
         (auVar143._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar311) *
         auVar143._0_4_ + fVar311 * fVar224;
    auVar233._4_4_ =
         (auVar143._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar312) *
         auVar143._4_4_ + fVar312 * fVar244;
    auVar233._8_4_ =
         (auVar143._8_4_ * fStack_298 + fStack_218 * fVar313) * auVar143._8_4_ + fVar313 * fVar246;
    auVar233._12_4_ =
         (auVar143._12_4_ * fStack_294 + fStack_214 * fVar314) * auVar143._12_4_ + fVar314 * fVar248
    ;
    auVar233._16_4_ =
         (auVar143._16_4_ * fStack_290 + fStack_210 * fVar255) * auVar143._16_4_ + fVar255 * fVar250
    ;
    auVar233._20_4_ =
         (auVar143._20_4_ * fStack_28c + fStack_20c * fVar223) * auVar143._20_4_ + fVar223 * fVar252
    ;
    auVar233._24_4_ =
         (auVar143._24_4_ * fStack_288 + fStack_208 * fVar273) * auVar143._24_4_ + fVar273 * fVar254
    ;
    auVar233._28_4_ = fVar382 + fVar310 + fVar309;
    fVar257 = auVar318._0_4_ * fVar311 + auVar143._0_4_ * auVar100._0_4_;
    fVar275 = auVar318._4_4_ * fVar312 + auVar143._4_4_ * auVar100._4_4_;
    fVar279 = auVar318._8_4_ * fVar313 + auVar143._8_4_ * auVar100._8_4_;
    fVar283 = auVar318._12_4_ * fVar314 + auVar143._12_4_ * auVar100._12_4_;
    fVar287 = auVar318._16_4_ * fVar255 + auVar143._16_4_ * auVar100._16_4_;
    fVar291 = auVar318._20_4_ * fVar223 + auVar143._20_4_ * auVar100._20_4_;
    fVar295 = auVar318._24_4_ * fVar273 + auVar143._24_4_ * auVar100._24_4_;
    fVar297 = fVar382 + fStack_1e4;
    local_a60._0_4_ = auVar329._0_4_ * fVar311 + auVar143._0_4_ * auVar195._0_4_;
    local_a60._4_4_ = auVar329._4_4_ * fVar312 + auVar143._4_4_ * auVar195._4_4_;
    local_a60._8_4_ = auVar329._8_4_ * fVar313 + auVar143._8_4_ * auVar195._8_4_;
    local_a60._12_4_ = auVar329._12_4_ * fVar314 + auVar143._12_4_ * auVar195._12_4_;
    local_a60._16_4_ = auVar329._16_4_ * fVar255 + auVar143._16_4_ * auVar195._16_4_;
    local_a60._20_4_ = auVar329._20_4_ * fVar223 + auVar143._20_4_ * auVar195._20_4_;
    local_a60._24_4_ = auVar329._24_4_ * fVar273 + auVar143._24_4_ * auVar195._24_4_;
    local_a60._28_4_ = fStack_1e4 + fVar364;
    local_300._0_4_ = auVar340._0_4_ * fVar311 + auVar143._0_4_ * auVar211._0_4_;
    local_300._4_4_ = auVar340._4_4_ * fVar312 + auVar143._4_4_ * auVar211._4_4_;
    local_300._8_4_ = auVar340._8_4_ * fVar313 + auVar143._8_4_ * auVar211._8_4_;
    local_300._12_4_ = auVar340._12_4_ * fVar314 + auVar143._12_4_ * auVar211._12_4_;
    local_300._16_4_ = auVar340._16_4_ * fVar255 + auVar143._16_4_ * auVar211._16_4_;
    local_300._20_4_ = auVar340._20_4_ * fVar223 + auVar143._20_4_ * auVar211._20_4_;
    local_300._24_4_ = auVar340._24_4_ * fVar273 + auVar143._24_4_ * auVar211._24_4_;
    local_300._28_4_ = fVar364 + fStack_1e4;
    local_c80._0_4_ = auVar184._0_4_;
    auVar268._0_4_ = fVar311 * auVar305._0_4_ + auVar143._0_4_ * auVar233._0_4_;
    auVar268._4_4_ = fVar312 * auVar305._4_4_ + auVar143._4_4_ * auVar233._4_4_;
    auVar268._8_4_ = fVar313 * auVar305._8_4_ + auVar143._8_4_ * auVar233._8_4_;
    auVar268._12_4_ = fVar314 * auVar305._12_4_ + auVar143._12_4_ * auVar233._12_4_;
    auVar268._16_4_ = fVar255 * auVar305._16_4_ + auVar143._16_4_ * auVar233._16_4_;
    auVar268._20_4_ = fVar223 * auVar305._20_4_ + auVar143._20_4_ * auVar233._20_4_;
    auVar268._24_4_ = fVar273 * auVar305._24_4_ + auVar143._24_4_ * auVar233._24_4_;
    auVar268._28_4_ = auVar95._28_4_ + auVar143._28_4_;
    auVar95 = vsubps_avx(auVar100,auVar318);
    auVar10 = vsubps_avx(auVar195,auVar329);
    auVar107 = vsubps_avx(auVar211,auVar340);
    auVar11 = vsubps_avx(auVar233,auVar305);
    auVar181 = vshufps_avx(ZEXT416((uint)((float)local_c80._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_c80._0_4_ * 0.04761905)),0);
    fVar251 = auVar181._0_4_;
    fVar352 = fVar251 * auVar95._0_4_ * 3.0;
    fVar293 = auVar181._4_4_;
    fVar358 = fVar293 * auVar95._4_4_ * 3.0;
    local_980._4_4_ = fVar358;
    local_980._0_4_ = fVar352;
    fVar222 = auVar181._8_4_;
    fVar359 = fVar222 * auVar95._8_4_ * 3.0;
    local_980._8_4_ = fVar359;
    fVar281 = auVar181._12_4_;
    fVar360 = fVar281 * auVar95._12_4_ * 3.0;
    local_980._12_4_ = fVar360;
    fVar361 = fVar251 * auVar95._16_4_ * 3.0;
    local_980._16_4_ = fVar361;
    fVar362 = fVar293 * auVar95._20_4_ * 3.0;
    local_980._20_4_ = fVar362;
    fVar363 = fVar222 * auVar95._24_4_ * 3.0;
    local_980._24_4_ = fVar363;
    local_980._28_4_ = fVar364;
    fVar338 = fVar251 * auVar10._0_4_ * 3.0;
    fVar346 = fVar293 * auVar10._4_4_ * 3.0;
    auVar21._4_4_ = fVar346;
    auVar21._0_4_ = fVar338;
    fVar347 = fVar222 * auVar10._8_4_ * 3.0;
    auVar21._8_4_ = fVar347;
    fVar348 = fVar281 * auVar10._12_4_ * 3.0;
    auVar21._12_4_ = fVar348;
    fVar349 = fVar251 * auVar10._16_4_ * 3.0;
    auVar21._16_4_ = fVar349;
    fVar350 = fVar293 * auVar10._20_4_ * 3.0;
    auVar21._20_4_ = fVar350;
    fVar351 = fVar222 * auVar10._24_4_ * 3.0;
    auVar21._24_4_ = fVar351;
    auVar21._28_4_ = auVar340._28_4_;
    fVar365 = fVar251 * auVar107._0_4_ * 3.0;
    fVar370 = fVar293 * auVar107._4_4_ * 3.0;
    auVar22._4_4_ = fVar370;
    auVar22._0_4_ = fVar365;
    fVar372 = fVar222 * auVar107._8_4_ * 3.0;
    auVar22._8_4_ = fVar372;
    fVar374 = fVar281 * auVar107._12_4_ * 3.0;
    auVar22._12_4_ = fVar374;
    fVar376 = fVar251 * auVar107._16_4_ * 3.0;
    auVar22._16_4_ = fVar376;
    fVar378 = fVar293 * auVar107._20_4_ * 3.0;
    auVar22._20_4_ = fVar378;
    fVar380 = fVar222 * auVar107._24_4_ * 3.0;
    auVar22._24_4_ = fVar380;
    auVar22._28_4_ = fVar382;
    fVar314 = fVar251 * auVar11._0_4_ * 3.0;
    fVar255 = fVar293 * auVar11._4_4_ * 3.0;
    auVar23._4_4_ = fVar255;
    auVar23._0_4_ = fVar314;
    fVar245 = fVar222 * auVar11._8_4_ * 3.0;
    auVar23._8_4_ = fVar245;
    fVar281 = fVar281 * auVar11._12_4_ * 3.0;
    auVar23._12_4_ = fVar281;
    fVar251 = fVar251 * auVar11._16_4_ * 3.0;
    auVar23._16_4_ = fVar251;
    fVar293 = fVar293 * auVar11._20_4_ * 3.0;
    auVar23._20_4_ = fVar293;
    fVar222 = fVar222 * auVar11._24_4_ * 3.0;
    auVar23._24_4_ = fVar222;
    auVar23._28_4_ = auVar10._28_4_;
    auVar95 = vperm2f128_avx(local_a60,local_a60,1);
    auVar95 = vshufps_avx(auVar95,local_a60,0x30);
    auVar11 = vshufps_avx(local_a60,auVar95,0x29);
    auVar95 = vperm2f128_avx(local_300,local_300,1);
    auVar95 = vshufps_avx(auVar95,local_300,0x30);
    auVar12 = vshufps_avx(local_300,auVar95,0x29);
    auVar107 = vsubps_avx(auVar268,auVar23);
    auVar95 = vperm2f128_avx(auVar107,auVar107,1);
    auVar95 = vshufps_avx(auVar95,auVar107,0x30);
    local_640 = vshufps_avx(auVar107,auVar95,0x29);
    local_540 = vsubps_avx(auVar11,local_a60);
    local_320 = vsubps_avx(auVar12,local_300);
    fVar310 = local_540._0_4_;
    fVar223 = local_540._4_4_;
    auVar24._4_4_ = fVar370 * fVar223;
    auVar24._0_4_ = fVar365 * fVar310;
    fVar247 = local_540._8_4_;
    auVar24._8_4_ = fVar372 * fVar247;
    fVar253 = local_540._12_4_;
    auVar24._12_4_ = fVar374 * fVar253;
    fVar244 = local_540._16_4_;
    auVar24._16_4_ = fVar376 * fVar244;
    fVar256 = local_540._20_4_;
    auVar24._20_4_ = fVar378 * fVar256;
    fVar294 = local_540._24_4_;
    auVar24._24_4_ = fVar380 * fVar294;
    auVar24._28_4_ = auVar107._28_4_;
    fVar311 = local_320._0_4_;
    fVar273 = local_320._4_4_;
    auVar25._4_4_ = fVar346 * fVar273;
    auVar25._0_4_ = fVar338 * fVar311;
    fVar285 = local_320._8_4_;
    auVar25._8_4_ = fVar347 * fVar285;
    fVar219 = local_320._12_4_;
    auVar25._12_4_ = fVar348 * fVar219;
    fVar246 = local_320._16_4_;
    auVar25._16_4_ = fVar349 * fVar246;
    fVar274 = local_320._20_4_;
    auVar25._20_4_ = fVar350 * fVar274;
    fVar16 = local_320._24_4_;
    auVar25._24_4_ = fVar351 * fVar16;
    auVar25._28_4_ = auVar95._28_4_;
    auVar212 = vsubps_avx(auVar25,auVar24);
    auVar69._4_4_ = fVar275;
    auVar69._0_4_ = fVar257;
    auVar69._8_4_ = fVar279;
    auVar69._12_4_ = fVar283;
    auVar69._16_4_ = fVar287;
    auVar69._20_4_ = fVar291;
    auVar69._24_4_ = fVar295;
    auVar69._28_4_ = fVar297;
    auVar95 = vperm2f128_avx(auVar69,auVar69,1);
    auVar95 = vshufps_avx(auVar95,auVar69,0x30);
    auVar13 = vshufps_avx(auVar69,auVar95,0x29);
    local_560 = vsubps_avx(auVar13,auVar69);
    auVar26._4_4_ = fVar358 * fVar273;
    auVar26._0_4_ = fVar352 * fVar311;
    auVar26._8_4_ = fVar359 * fVar285;
    auVar26._12_4_ = fVar360 * fVar219;
    auVar26._16_4_ = fVar361 * fVar246;
    auVar26._20_4_ = fVar362 * fVar274;
    auVar26._24_4_ = fVar363 * fVar16;
    auVar26._28_4_ = auVar13._28_4_;
    fVar312 = local_560._0_4_;
    fVar243 = local_560._4_4_;
    auVar27._4_4_ = fVar370 * fVar243;
    auVar27._0_4_ = fVar365 * fVar312;
    fVar249 = local_560._8_4_;
    auVar27._8_4_ = fVar372 * fVar249;
    fVar220 = local_560._12_4_;
    auVar27._12_4_ = fVar374 * fVar220;
    fVar248 = local_560._16_4_;
    auVar27._16_4_ = fVar376 * fVar248;
    fVar278 = local_560._20_4_;
    auVar27._20_4_ = fVar378 * fVar278;
    fVar17 = local_560._24_4_;
    auVar27._24_4_ = fVar380 * fVar17;
    auVar27._28_4_ = auVar318._28_4_;
    auVar14 = vsubps_avx(auVar27,auVar26);
    auVar28._4_4_ = fVar346 * fVar243;
    auVar28._0_4_ = fVar338 * fVar312;
    auVar28._8_4_ = fVar347 * fVar249;
    auVar28._12_4_ = fVar348 * fVar220;
    auVar28._16_4_ = fVar349 * fVar248;
    auVar28._20_4_ = fVar350 * fVar278;
    auVar28._24_4_ = fVar351 * fVar17;
    auVar28._28_4_ = auVar318._28_4_;
    auVar29._4_4_ = fVar358 * fVar223;
    auVar29._0_4_ = fVar352 * fVar310;
    auVar29._8_4_ = fVar359 * fVar247;
    auVar29._12_4_ = fVar360 * fVar253;
    auVar29._16_4_ = fVar361 * fVar244;
    auVar29._20_4_ = fVar362 * fVar256;
    auVar29._24_4_ = fVar363 * fVar294;
    auVar29._28_4_ = auVar329._28_4_;
    auVar213 = vsubps_avx(auVar29,auVar28);
    fVar309 = auVar213._28_4_;
    auVar196._0_4_ = fVar312 * fVar312 + fVar310 * fVar310 + fVar311 * fVar311;
    auVar196._4_4_ = fVar243 * fVar243 + fVar223 * fVar223 + fVar273 * fVar273;
    auVar196._8_4_ = fVar249 * fVar249 + fVar247 * fVar247 + fVar285 * fVar285;
    auVar196._12_4_ = fVar220 * fVar220 + fVar253 * fVar253 + fVar219 * fVar219;
    auVar196._16_4_ = fVar248 * fVar248 + fVar244 * fVar244 + fVar246 * fVar246;
    auVar196._20_4_ = fVar278 * fVar278 + fVar256 * fVar256 + fVar274 * fVar274;
    auVar196._24_4_ = fVar17 * fVar17 + fVar294 * fVar294 + fVar16 * fVar16;
    auVar196._28_4_ = fVar309 + fVar309 + auVar212._28_4_;
    auVar95 = vrcpps_avx(auVar196);
    fVar224 = auVar95._0_4_;
    fVar252 = auVar95._4_4_;
    auVar30._4_4_ = fVar252 * auVar196._4_4_;
    auVar30._0_4_ = fVar224 * auVar196._0_4_;
    fVar254 = auVar95._8_4_;
    auVar30._8_4_ = fVar254 * auVar196._8_4_;
    fVar286 = auVar95._12_4_;
    auVar30._12_4_ = fVar286 * auVar196._12_4_;
    fVar290 = auVar95._16_4_;
    auVar30._16_4_ = fVar290 * auVar196._16_4_;
    fVar321 = auVar95._20_4_;
    auVar30._20_4_ = fVar321 * auVar196._20_4_;
    fVar322 = auVar95._24_4_;
    auVar30._24_4_ = fVar322 * auVar196._24_4_;
    auVar30._28_4_ = auVar329._28_4_;
    auVar101._8_4_ = 0x3f800000;
    auVar101._0_8_ = 0x3f8000003f800000;
    auVar101._12_4_ = 0x3f800000;
    auVar101._16_4_ = 0x3f800000;
    auVar101._20_4_ = 0x3f800000;
    auVar101._24_4_ = 0x3f800000;
    auVar101._28_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar101,auVar30);
    fVar224 = fVar224 + fVar224 * auVar19._0_4_;
    fVar252 = fVar252 + fVar252 * auVar19._4_4_;
    fVar254 = fVar254 + fVar254 * auVar19._8_4_;
    fVar286 = fVar286 + fVar286 * auVar19._12_4_;
    fVar290 = fVar290 + fVar290 * auVar19._16_4_;
    fVar321 = fVar321 + fVar321 * auVar19._20_4_;
    fVar322 = fVar322 + fVar322 * auVar19._24_4_;
    auVar107 = vperm2f128_avx(auVar21,auVar21,1);
    auVar107 = vshufps_avx(auVar107,auVar21,0x30);
    local_ae0 = vshufps_avx(auVar21,auVar107,0x29);
    auVar107 = vperm2f128_avx(auVar22,auVar22,1);
    auVar107 = vshufps_avx(auVar107,auVar22,0x30);
    local_a40 = vshufps_avx(auVar22,auVar107,0x29);
    fVar83 = local_a40._0_4_;
    fVar114 = local_a40._4_4_;
    auVar31._4_4_ = fVar114 * fVar223;
    auVar31._0_4_ = fVar83 * fVar310;
    fVar116 = local_a40._8_4_;
    auVar31._8_4_ = fVar116 * fVar247;
    fVar118 = local_a40._12_4_;
    auVar31._12_4_ = fVar118 * fVar253;
    fVar119 = local_a40._16_4_;
    auVar31._16_4_ = fVar119 * fVar244;
    fVar120 = local_a40._20_4_;
    auVar31._20_4_ = fVar120 * fVar256;
    fVar121 = local_a40._24_4_;
    auVar31._24_4_ = fVar121 * fVar294;
    auVar31._28_4_ = auVar107._28_4_;
    fVar313 = local_ae0._0_4_;
    fVar277 = local_ae0._4_4_;
    auVar32._4_4_ = fVar273 * fVar277;
    auVar32._0_4_ = fVar311 * fVar313;
    fVar289 = local_ae0._8_4_;
    auVar32._8_4_ = fVar285 * fVar289;
    fVar221 = local_ae0._12_4_;
    auVar32._12_4_ = fVar219 * fVar221;
    fVar250 = local_ae0._16_4_;
    auVar32._16_4_ = fVar246 * fVar250;
    fVar282 = local_ae0._20_4_;
    auVar32._20_4_ = fVar274 * fVar282;
    fVar388 = local_ae0._24_4_;
    auVar32._24_4_ = fVar16 * fVar388;
    auVar32._28_4_ = auVar340._28_4_;
    auVar20 = vsubps_avx(auVar32,auVar31);
    auVar107 = vperm2f128_avx(local_980,local_980,1);
    auVar107 = vshufps_avx(auVar107,local_980,0x30);
    local_920 = vshufps_avx(local_980,auVar107,0x29);
    fVar366 = local_920._0_4_;
    fVar371 = local_920._4_4_;
    auVar33._4_4_ = fVar371 * fVar273;
    auVar33._0_4_ = fVar366 * fVar311;
    fVar373 = local_920._8_4_;
    auVar33._8_4_ = fVar373 * fVar285;
    fVar375 = local_920._12_4_;
    auVar33._12_4_ = fVar375 * fVar219;
    fVar377 = local_920._16_4_;
    auVar33._16_4_ = fVar377 * fVar246;
    fVar379 = local_920._20_4_;
    auVar33._20_4_ = fVar379 * fVar274;
    fVar381 = local_920._24_4_;
    auVar33._24_4_ = fVar381 * fVar16;
    auVar33._28_4_ = auVar107._28_4_;
    auVar34._4_4_ = fVar243 * fVar114;
    auVar34._0_4_ = fVar312 * fVar83;
    auVar34._8_4_ = fVar249 * fVar116;
    auVar34._12_4_ = fVar220 * fVar118;
    auVar34._16_4_ = fVar248 * fVar119;
    auVar34._20_4_ = fVar278 * fVar120;
    auVar34._24_4_ = fVar17 * fVar121;
    auVar34._28_4_ = fVar364;
    auVar107 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ = fVar243 * fVar277;
    auVar35._0_4_ = fVar312 * fVar313;
    auVar35._8_4_ = fVar249 * fVar289;
    auVar35._12_4_ = fVar220 * fVar221;
    auVar35._16_4_ = fVar248 * fVar250;
    auVar35._20_4_ = fVar278 * fVar282;
    auVar35._24_4_ = fVar17 * fVar388;
    auVar35._28_4_ = fVar364;
    auVar36._4_4_ = fVar371 * fVar223;
    auVar36._0_4_ = fVar366 * fVar310;
    auVar36._8_4_ = fVar373 * fVar247;
    auVar36._12_4_ = fVar375 * fVar253;
    auVar36._16_4_ = fVar377 * fVar244;
    auVar36._20_4_ = fVar379 * fVar256;
    fVar364 = local_920._28_4_;
    auVar36._24_4_ = fVar381 * fVar294;
    auVar36._28_4_ = fVar364;
    auVar96 = vsubps_avx(auVar36,auVar35);
    auVar37._4_4_ =
         fVar252 * (auVar212._4_4_ * auVar212._4_4_ +
                   auVar213._4_4_ * auVar213._4_4_ + auVar14._4_4_ * auVar14._4_4_);
    auVar37._0_4_ =
         fVar224 * (auVar212._0_4_ * auVar212._0_4_ +
                   auVar213._0_4_ * auVar213._0_4_ + auVar14._0_4_ * auVar14._0_4_);
    auVar37._8_4_ =
         fVar254 * (auVar212._8_4_ * auVar212._8_4_ +
                   auVar213._8_4_ * auVar213._8_4_ + auVar14._8_4_ * auVar14._8_4_);
    auVar37._12_4_ =
         fVar286 * (auVar212._12_4_ * auVar212._12_4_ +
                   auVar213._12_4_ * auVar213._12_4_ + auVar14._12_4_ * auVar14._12_4_);
    auVar37._16_4_ =
         fVar290 * (auVar212._16_4_ * auVar212._16_4_ +
                   auVar213._16_4_ * auVar213._16_4_ + auVar14._16_4_ * auVar14._16_4_);
    auVar37._20_4_ =
         fVar321 * (auVar212._20_4_ * auVar212._20_4_ +
                   auVar213._20_4_ * auVar213._20_4_ + auVar14._20_4_ * auVar14._20_4_);
    auVar37._24_4_ =
         fVar322 * (auVar212._24_4_ * auVar212._24_4_ +
                   auVar213._24_4_ * auVar213._24_4_ + auVar14._24_4_ * auVar14._24_4_);
    auVar37._28_4_ = auVar212._28_4_ + fVar309 + auVar14._28_4_;
    auVar38._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar107._4_4_ * auVar107._4_4_ + auVar96._4_4_ * auVar96._4_4_) * fVar252;
    auVar38._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar107._0_4_ * auVar107._0_4_ + auVar96._0_4_ * auVar96._0_4_) * fVar224;
    auVar38._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar107._8_4_ * auVar107._8_4_ + auVar96._8_4_ * auVar96._8_4_) * fVar254;
    auVar38._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar107._12_4_ * auVar107._12_4_ + auVar96._12_4_ * auVar96._12_4_) * fVar286;
    auVar38._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar107._16_4_ * auVar107._16_4_ + auVar96._16_4_ * auVar96._16_4_) * fVar290;
    auVar38._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar107._20_4_ * auVar107._20_4_ + auVar96._20_4_ * auVar96._20_4_) * fVar321;
    auVar38._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar107._24_4_ * auVar107._24_4_ + auVar96._24_4_ * auVar96._24_4_) * fVar322;
    auVar38._28_4_ = auVar95._28_4_ + auVar19._28_4_;
    auVar95 = vmaxps_avx(auVar37,auVar38);
    auVar107 = vperm2f128_avx(auVar268,auVar268,1);
    auVar107 = vshufps_avx(auVar107,auVar268,0x30);
    local_660 = vshufps_avx(auVar268,auVar107,0x29);
    auVar165._0_4_ = auVar268._0_4_ + fVar314;
    auVar165._4_4_ = auVar268._4_4_ + fVar255;
    auVar165._8_4_ = auVar268._8_4_ + fVar245;
    auVar165._12_4_ = auVar268._12_4_ + fVar281;
    auVar165._16_4_ = auVar268._16_4_ + fVar251;
    auVar165._20_4_ = auVar268._20_4_ + fVar293;
    auVar165._24_4_ = auVar268._24_4_ + fVar222;
    auVar165._28_4_ = auVar268._28_4_ + auVar10._28_4_;
    auVar107 = vmaxps_avx(auVar268,auVar165);
    auVar10 = vmaxps_avx(local_640,local_660);
    auVar107 = vmaxps_avx(auVar107,auVar10);
    auVar10 = vrsqrtps_avx(auVar196);
    fVar309 = auVar10._0_4_;
    fVar314 = auVar10._4_4_;
    fVar255 = auVar10._8_4_;
    fVar245 = auVar10._12_4_;
    fVar281 = auVar10._16_4_;
    fVar251 = auVar10._20_4_;
    fVar293 = auVar10._24_4_;
    local_5e0 = fVar309 * 1.5 + fVar309 * fVar309 * fVar309 * auVar196._0_4_ * -0.5;
    fStack_5dc = fVar314 * 1.5 + fVar314 * fVar314 * fVar314 * auVar196._4_4_ * -0.5;
    fStack_5d8 = fVar255 * 1.5 + fVar255 * fVar255 * fVar255 * auVar196._8_4_ * -0.5;
    fStack_5d4 = fVar245 * 1.5 + fVar245 * fVar245 * fVar245 * auVar196._12_4_ * -0.5;
    fStack_5d0 = fVar281 * 1.5 + fVar281 * fVar281 * fVar281 * auVar196._16_4_ * -0.5;
    fStack_5cc = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar196._20_4_ * -0.5;
    fStack_5c8 = fVar293 * 1.5 + fVar293 * fVar293 * fVar293 * auVar196._24_4_ * -0.5;
    auVar212 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_7e0 = vsubps_avx(auVar212,local_a60);
    auVar212 = vsubps_avx(auVar212,local_300);
    fVar327 = auVar212._0_4_;
    fVar332 = auVar212._4_4_;
    fVar333 = auVar212._8_4_;
    fVar334 = auVar212._12_4_;
    fVar335 = auVar212._16_4_;
    fVar336 = auVar212._20_4_;
    fVar337 = auVar212._24_4_;
    fVar314 = local_7e0._0_4_;
    fVar245 = local_7e0._4_4_;
    fVar251 = local_7e0._8_4_;
    fVar222 = local_7e0._12_4_;
    fVar252 = local_7e0._16_4_;
    fVar286 = local_7e0._20_4_;
    fVar321 = local_7e0._24_4_;
    auVar70._4_4_ = fVar275;
    auVar70._0_4_ = fVar257;
    auVar70._8_4_ = fVar279;
    auVar70._12_4_ = fVar283;
    auVar70._16_4_ = fVar287;
    auVar70._20_4_ = fVar291;
    auVar70._24_4_ = fVar295;
    auVar70._28_4_ = fVar297;
    auVar213 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar212 = vsubps_avx(auVar213,auVar70);
    fVar255 = auVar212._0_4_;
    fVar281 = auVar212._4_4_;
    fVar293 = auVar212._8_4_;
    fVar224 = auVar212._12_4_;
    fVar254 = auVar212._16_4_;
    fVar290 = auVar212._20_4_;
    fVar322 = auVar212._24_4_;
    auVar355._0_4_ =
         (float)local_a80._0_4_ * fVar255 +
         (float)local_6e0._0_4_ * fVar314 + fVar327 * (float)local_880._0_4_;
    auVar355._4_4_ =
         (float)local_a80._4_4_ * fVar281 +
         (float)local_6e0._4_4_ * fVar245 + fVar332 * (float)local_880._4_4_;
    auVar355._8_4_ = fStack_a78 * fVar293 + fStack_6d8 * fVar251 + fVar333 * fStack_878;
    auVar355._12_4_ = fStack_a74 * fVar224 + fStack_6d4 * fVar222 + fVar334 * fStack_874;
    auVar355._16_4_ = fStack_a70 * fVar254 + fStack_6d0 * fVar252 + fVar335 * fStack_870;
    auVar355._20_4_ = fStack_a6c * fVar290 + fStack_6cc * fVar286 + fVar336 * fStack_86c;
    auVar355._24_4_ = fStack_a68 * fVar322 + fStack_6c8 * fVar321 + fVar337 * fStack_868;
    auVar355._28_4_ = fVar364 + auVar96._28_4_ + auVar196._28_4_;
    auVar369._0_4_ = fVar255 * fVar255 + fVar314 * fVar314 + fVar327 * fVar327;
    auVar369._4_4_ = fVar281 * fVar281 + fVar245 * fVar245 + fVar332 * fVar332;
    auVar369._8_4_ = fVar293 * fVar293 + fVar251 * fVar251 + fVar333 * fVar333;
    auVar369._12_4_ = fVar224 * fVar224 + fVar222 * fVar222 + fVar334 * fVar334;
    auVar369._16_4_ = fVar254 * fVar254 + fVar252 * fVar252 + fVar335 * fVar335;
    auVar369._20_4_ = fVar290 * fVar290 + fVar286 * fVar286 + fVar336 * fVar336;
    auVar369._24_4_ = fVar322 * fVar322 + fVar321 * fVar321 + fVar337 * fVar337;
    auVar369._28_4_ = local_300._28_4_ + local_300._28_4_ + fVar364;
    local_580._0_4_ =
         (float)local_a80._0_4_ * fVar312 * local_5e0 +
         local_5e0 * fVar310 * (float)local_6e0._0_4_ + fVar311 * local_5e0 * (float)local_880._0_4_
    ;
    local_580._4_4_ =
         (float)local_a80._4_4_ * fVar243 * fStack_5dc +
         fStack_5dc * fVar223 * (float)local_6e0._4_4_ +
         fVar273 * fStack_5dc * (float)local_880._4_4_;
    local_580._8_4_ =
         fStack_a78 * fVar249 * fStack_5d8 +
         fStack_5d8 * fVar247 * fStack_6d8 + fVar285 * fStack_5d8 * fStack_878;
    local_580._12_4_ =
         fStack_a74 * fVar220 * fStack_5d4 +
         fStack_5d4 * fVar253 * fStack_6d4 + fVar219 * fStack_5d4 * fStack_874;
    local_580._16_4_ =
         fStack_a70 * fVar248 * fStack_5d0 +
         fStack_5d0 * fVar244 * fStack_6d0 + fVar246 * fStack_5d0 * fStack_870;
    local_580._20_4_ =
         fStack_a6c * fVar278 * fStack_5cc +
         fStack_5cc * fVar256 * fStack_6cc + fVar274 * fStack_5cc * fStack_86c;
    local_580._24_4_ =
         fStack_a68 * fVar17 * fStack_5c8 +
         fStack_5c8 * fVar294 * fStack_6c8 + fVar16 * fStack_5c8 * fStack_868;
    local_580._28_4_ = fStack_a64 + fStack_6c4 + fStack_864;
    fVar309 = fStack_a64 + fStack_6c4 + fStack_864;
    local_600._0_4_ =
         fVar255 * fVar312 * local_5e0 +
         local_5e0 * fVar310 * fVar314 + fVar327 * fVar311 * local_5e0;
    local_600._4_4_ =
         fVar281 * fVar243 * fStack_5dc +
         fStack_5dc * fVar223 * fVar245 + fVar332 * fVar273 * fStack_5dc;
    local_600._8_4_ =
         fVar293 * fVar249 * fStack_5d8 +
         fStack_5d8 * fVar247 * fVar251 + fVar333 * fVar285 * fStack_5d8;
    local_600._12_4_ =
         fVar224 * fVar220 * fStack_5d4 +
         fStack_5d4 * fVar253 * fVar222 + fVar334 * fVar219 * fStack_5d4;
    local_600._16_4_ =
         fVar254 * fVar248 * fStack_5d0 +
         fStack_5d0 * fVar244 * fVar252 + fVar335 * fVar246 * fStack_5d0;
    local_600._20_4_ =
         fVar290 * fVar278 * fStack_5cc +
         fStack_5cc * fVar256 * fVar286 + fVar336 * fVar274 * fStack_5cc;
    local_600._24_4_ =
         fVar322 * fVar17 * fStack_5c8 +
         fStack_5c8 * fVar294 * fVar321 + fVar337 * fVar16 * fStack_5c8;
    local_600._28_4_ = fStack_6c4 + fVar309;
    auVar39._4_4_ = local_580._4_4_ * local_600._4_4_;
    auVar39._0_4_ = local_580._0_4_ * local_600._0_4_;
    auVar39._8_4_ = local_580._8_4_ * local_600._8_4_;
    auVar39._12_4_ = local_580._12_4_ * local_600._12_4_;
    auVar39._16_4_ = local_580._16_4_ * local_600._16_4_;
    auVar39._20_4_ = local_580._20_4_ * local_600._20_4_;
    auVar39._24_4_ = local_580._24_4_ * local_600._24_4_;
    auVar39._28_4_ = fVar309;
    auVar212 = vsubps_avx(auVar355,auVar39);
    auVar40._4_4_ = local_600._4_4_ * local_600._4_4_;
    auVar40._0_4_ = local_600._0_4_ * local_600._0_4_;
    auVar40._8_4_ = local_600._8_4_ * local_600._8_4_;
    auVar40._12_4_ = local_600._12_4_ * local_600._12_4_;
    auVar40._16_4_ = local_600._16_4_ * local_600._16_4_;
    auVar40._20_4_ = local_600._20_4_ * local_600._20_4_;
    auVar40._24_4_ = local_600._24_4_ * local_600._24_4_;
    auVar40._28_4_ = fStack_6c4;
    local_680 = vsubps_avx(auVar369,auVar40);
    local_2e0 = vsqrtps_avx(auVar95);
    fVar309 = (local_2e0._0_4_ + auVar107._0_4_) * 1.0000002;
    fVar364 = (local_2e0._4_4_ + auVar107._4_4_) * 1.0000002;
    fVar172 = (local_2e0._8_4_ + auVar107._8_4_) * 1.0000002;
    fVar173 = (local_2e0._12_4_ + auVar107._12_4_) * 1.0000002;
    fVar174 = (local_2e0._16_4_ + auVar107._16_4_) * 1.0000002;
    fVar175 = (local_2e0._20_4_ + auVar107._20_4_) * 1.0000002;
    fVar176 = (local_2e0._24_4_ + auVar107._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar364 * fVar364;
    auVar41._0_4_ = fVar309 * fVar309;
    auVar41._8_4_ = fVar172 * fVar172;
    auVar41._12_4_ = fVar173 * fVar173;
    auVar41._16_4_ = fVar174 * fVar174;
    auVar41._20_4_ = fVar175 * fVar175;
    auVar41._24_4_ = fVar176 * fVar176;
    auVar41._28_4_ = local_2e0._28_4_ + auVar107._28_4_;
    local_9e0._0_4_ = auVar212._0_4_ + auVar212._0_4_;
    local_9e0._4_4_ = auVar212._4_4_ + auVar212._4_4_;
    local_9e0._8_4_ = auVar212._8_4_ + auVar212._8_4_;
    local_9e0._12_4_ = auVar212._12_4_ + auVar212._12_4_;
    local_9e0._16_4_ = auVar212._16_4_ + auVar212._16_4_;
    local_9e0._20_4_ = auVar212._20_4_ + auVar212._20_4_;
    local_9e0._24_4_ = auVar212._24_4_ + auVar212._24_4_;
    fVar309 = auVar212._28_4_;
    local_9e0._28_4_ = fVar309 + fVar309;
    auVar107 = vsubps_avx(local_680,auVar41);
    auVar42._4_4_ = local_580._4_4_ * local_580._4_4_;
    auVar42._0_4_ = local_580._0_4_ * local_580._0_4_;
    auVar42._8_4_ = local_580._8_4_ * local_580._8_4_;
    auVar42._12_4_ = local_580._12_4_ * local_580._12_4_;
    auVar42._16_4_ = local_580._16_4_ * local_580._16_4_;
    auVar42._20_4_ = local_580._20_4_ * local_580._20_4_;
    auVar42._24_4_ = local_580._24_4_ * local_580._24_4_;
    auVar42._28_4_ = fVar309;
    auVar212 = vsubps_avx(local_2c0,auVar42);
    local_6a0._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
    local_6a0._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
    local_6a0._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    local_6a0._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    local_6a0._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    local_6a0._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    local_6a0._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    local_6a0._28_4_ = local_2c0._28_4_;
    fVar309 = auVar212._0_4_;
    local_6c0._0_4_ = fVar309 * 4.0;
    fVar364 = auVar212._4_4_;
    local_6c0._4_4_ = fVar364 * 4.0;
    fVar172 = auVar212._8_4_;
    fStack_6b8 = fVar172 * 4.0;
    fVar173 = auVar212._12_4_;
    fStack_6b4 = fVar173 * 4.0;
    fVar174 = auVar212._16_4_;
    fStack_6b0 = fVar174 * 4.0;
    fVar175 = auVar212._20_4_;
    fStack_6ac = fVar175 * 4.0;
    fVar176 = auVar212._24_4_;
    fStack_6a8 = fVar176 * 4.0;
    uStack_6a4 = 0x40800000;
    auVar43._4_4_ = auVar107._4_4_ * (float)local_6c0._4_4_;
    auVar43._0_4_ = auVar107._0_4_ * (float)local_6c0._0_4_;
    auVar43._8_4_ = auVar107._8_4_ * fStack_6b8;
    auVar43._12_4_ = auVar107._12_4_ * fStack_6b4;
    auVar43._16_4_ = auVar107._16_4_ * fStack_6b0;
    auVar43._20_4_ = auVar107._20_4_ * fStack_6ac;
    auVar43._24_4_ = auVar107._24_4_ * fStack_6a8;
    auVar43._28_4_ = 0x40800000;
    auVar14 = vsubps_avx(local_6a0,auVar43);
    auVar95 = vcmpps_avx(auVar14,auVar213,5);
    auVar102._8_4_ = 0x7fffffff;
    auVar102._0_8_ = 0x7fffffff7fffffff;
    auVar102._12_4_ = 0x7fffffff;
    auVar102._16_4_ = 0x7fffffff;
    auVar102._20_4_ = 0x7fffffff;
    auVar102._24_4_ = 0x7fffffff;
    auVar102._28_4_ = 0x7fffffff;
    local_460 = vandps_avx(auVar42,auVar102);
    local_360._0_4_ = fVar309 + fVar309;
    local_360._4_4_ = fVar364 + fVar364;
    local_360._8_4_ = fVar172 + fVar172;
    local_360._12_4_ = fVar173 + fVar173;
    local_360._16_4_ = fVar174 + fVar174;
    local_360._20_4_ = fVar175 + fVar175;
    local_360._24_4_ = fVar176 + fVar176;
    local_360._28_4_ = auVar212._28_4_ + auVar212._28_4_;
    local_9c0 = vandps_avx(auVar212,auVar102);
    uVar76 = CONCAT44(local_9e0._4_4_,local_9e0._0_4_);
    local_340._0_8_ = uVar76 ^ 0x8000000080000000;
    local_340._8_4_ = -local_9e0._8_4_;
    local_340._12_4_ = -local_9e0._12_4_;
    local_340._16_4_ = -local_9e0._16_4_;
    local_340._20_4_ = -local_9e0._20_4_;
    local_340._24_4_ = -local_9e0._24_4_;
    local_340._28_4_ = -local_9e0._28_4_;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f]) {
      local_940._8_4_ = 0x7f800000;
      local_940._0_8_ = 0x7f8000007f800000;
      local_940._12_4_ = 0x7f800000;
      local_940._16_4_ = 0x7f800000;
      local_940._20_4_ = 0x7f800000;
      local_940._24_4_ = 0x7f800000;
      local_940._28_4_ = 0x7f800000;
      auVar166._8_4_ = 0xff800000;
      auVar166._0_8_ = 0xff800000ff800000;
      auVar166._12_4_ = 0xff800000;
      auVar166._16_4_ = 0xff800000;
      auVar166._20_4_ = 0xff800000;
      auVar166._24_4_ = 0xff800000;
      auVar166._28_4_ = 0xff800000;
    }
    else {
      auVar20 = vsqrtps_avx(auVar14);
      auVar19 = vrcpps_avx(local_360);
      auVar212 = vcmpps_avx(auVar14,auVar213,5);
      fVar309 = auVar19._0_4_;
      fVar364 = auVar19._4_4_;
      auVar44._4_4_ = local_360._4_4_ * fVar364;
      auVar44._0_4_ = local_360._0_4_ * fVar309;
      fVar172 = auVar19._8_4_;
      auVar44._8_4_ = local_360._8_4_ * fVar172;
      fVar173 = auVar19._12_4_;
      auVar44._12_4_ = local_360._12_4_ * fVar173;
      fVar174 = auVar19._16_4_;
      auVar44._16_4_ = local_360._16_4_ * fVar174;
      fVar175 = auVar19._20_4_;
      auVar44._20_4_ = local_360._20_4_ * fVar175;
      fVar176 = auVar19._24_4_;
      auVar44._24_4_ = local_360._24_4_ * fVar176;
      auVar44._28_4_ = auVar14._28_4_;
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar103._16_4_ = 0x3f800000;
      auVar103._20_4_ = 0x3f800000;
      auVar103._24_4_ = 0x3f800000;
      auVar103._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar103,auVar44);
      fVar309 = fVar309 + fVar309 * auVar14._0_4_;
      fVar364 = fVar364 + fVar364 * auVar14._4_4_;
      fVar172 = fVar172 + fVar172 * auVar14._8_4_;
      fVar173 = fVar173 + fVar173 * auVar14._12_4_;
      fVar174 = fVar174 + fVar174 * auVar14._16_4_;
      fVar175 = fVar175 + fVar175 * auVar14._20_4_;
      fVar176 = fVar176 + fVar176 * auVar14._24_4_;
      auVar213 = vsubps_avx(local_340,auVar20);
      fVar258 = auVar213._0_4_ * fVar309;
      fVar276 = auVar213._4_4_ * fVar364;
      auVar45._4_4_ = fVar276;
      auVar45._0_4_ = fVar258;
      fVar280 = auVar213._8_4_ * fVar172;
      auVar45._8_4_ = fVar280;
      fVar284 = auVar213._12_4_ * fVar173;
      auVar45._12_4_ = fVar284;
      fVar288 = auVar213._16_4_ * fVar174;
      auVar45._16_4_ = fVar288;
      fVar292 = auVar213._20_4_ * fVar175;
      auVar45._20_4_ = fVar292;
      fVar296 = auVar213._24_4_ * fVar176;
      auVar45._24_4_ = fVar296;
      auVar45._28_4_ = auVar213._28_4_;
      auVar213 = vsubps_avx(auVar20,local_9e0);
      fVar309 = auVar213._0_4_ * fVar309;
      fVar364 = auVar213._4_4_ * fVar364;
      auVar46._4_4_ = fVar364;
      auVar46._0_4_ = fVar309;
      fVar172 = auVar213._8_4_ * fVar172;
      auVar46._8_4_ = fVar172;
      fVar173 = auVar213._12_4_ * fVar173;
      auVar46._12_4_ = fVar173;
      fVar174 = auVar213._16_4_ * fVar174;
      auVar46._16_4_ = fVar174;
      fVar175 = auVar213._20_4_ * fVar175;
      auVar46._20_4_ = fVar175;
      fVar176 = auVar213._24_4_ * fVar176;
      auVar46._24_4_ = fVar176;
      auVar46._28_4_ = auVar19._28_4_ + auVar14._28_4_;
      fStack_424 = local_600._28_4_ + auVar213._28_4_;
      local_440 = local_5e0 * (local_600._0_4_ + local_580._0_4_ * fVar258);
      fStack_43c = fStack_5dc * (local_600._4_4_ + local_580._4_4_ * fVar276);
      fStack_438 = fStack_5d8 * (local_600._8_4_ + local_580._8_4_ * fVar280);
      fStack_434 = fStack_5d4 * (local_600._12_4_ + local_580._12_4_ * fVar284);
      fStack_430 = fStack_5d0 * (local_600._16_4_ + local_580._16_4_ * fVar288);
      fStack_42c = fStack_5cc * (local_600._20_4_ + local_580._20_4_ * fVar292);
      fStack_428 = fStack_5c8 * (local_600._24_4_ + local_580._24_4_ * fVar296);
      local_420 = local_5e0 * (local_600._0_4_ + local_580._0_4_ * fVar309);
      fStack_41c = fStack_5dc * (local_600._4_4_ + local_580._4_4_ * fVar364);
      fStack_418 = fStack_5d8 * (local_600._8_4_ + local_580._8_4_ * fVar172);
      fStack_414 = fStack_5d4 * (local_600._12_4_ + local_580._12_4_ * fVar173);
      fStack_410 = fStack_5d0 * (local_600._16_4_ + local_580._16_4_ * fVar174);
      fStack_40c = fStack_5cc * (local_600._20_4_ + local_580._20_4_ * fVar175);
      fStack_408 = fStack_5c8 * (local_600._24_4_ + local_580._24_4_ * fVar176);
      fStack_404 = local_600._28_4_ + fStack_424;
      auVar234._8_4_ = 0x7f800000;
      auVar234._0_8_ = 0x7f8000007f800000;
      auVar234._12_4_ = 0x7f800000;
      auVar234._16_4_ = 0x7f800000;
      auVar234._20_4_ = 0x7f800000;
      auVar234._24_4_ = 0x7f800000;
      auVar234._28_4_ = 0x7f800000;
      local_940 = vblendvps_avx(auVar234,auVar45,auVar212);
      auVar235._8_4_ = 0xff800000;
      auVar235._0_8_ = 0xff800000ff800000;
      auVar235._12_4_ = 0xff800000;
      auVar235._16_4_ = 0xff800000;
      auVar235._20_4_ = 0xff800000;
      auVar235._24_4_ = 0xff800000;
      auVar235._28_4_ = 0xff800000;
      auVar166 = vblendvps_avx(auVar235,auVar46,auVar212);
      auVar14 = vmaxps_avx(local_5c0,local_460);
      auVar47._4_4_ = auVar14._4_4_ * 1.9073486e-06;
      auVar47._0_4_ = auVar14._0_4_ * 1.9073486e-06;
      auVar47._8_4_ = auVar14._8_4_ * 1.9073486e-06;
      auVar47._12_4_ = auVar14._12_4_ * 1.9073486e-06;
      auVar47._16_4_ = auVar14._16_4_ * 1.9073486e-06;
      auVar47._20_4_ = auVar14._20_4_ * 1.9073486e-06;
      auVar47._24_4_ = auVar14._24_4_ * 1.9073486e-06;
      auVar47._28_4_ = auVar14._28_4_;
      auVar14 = vcmpps_avx(local_9c0,auVar47,1);
      auVar213 = auVar212 & auVar14;
      if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar213 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar213 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar213 >> 0x7f,0) != '\0') ||
            (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar213 >> 0xbf,0) != '\0') ||
          (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar213[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar14,auVar212);
        auVar181 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar14 = vcmpps_avx(auVar107,_DAT_01f7b000,2);
        auVar326._8_4_ = 0xff800000;
        auVar326._0_8_ = 0xff800000ff800000;
        auVar326._12_4_ = 0xff800000;
        auVar326._16_4_ = 0xff800000;
        auVar326._20_4_ = 0xff800000;
        auVar326._24_4_ = 0xff800000;
        auVar326._28_4_ = 0xff800000;
        auVar357._8_4_ = 0x7f800000;
        auVar357._0_8_ = 0x7f8000007f800000;
        auVar357._12_4_ = 0x7f800000;
        auVar357._16_4_ = 0x7f800000;
        auVar357._20_4_ = 0x7f800000;
        auVar357._24_4_ = 0x7f800000;
        auVar357._28_4_ = 0x7f800000;
        auVar107 = vblendvps_avx(auVar357,auVar326,auVar14);
        auVar260 = vpmovsxwd_avx(auVar181);
        auVar181 = vpunpckhwd_avx(auVar181,auVar181);
        auVar271._16_16_ = auVar181;
        auVar271._0_16_ = auVar260;
        local_940 = vblendvps_avx(local_940,auVar107,auVar271);
        auVar107 = vblendvps_avx(auVar326,auVar357,auVar14);
        auVar166 = vblendvps_avx(auVar166,auVar107,auVar271);
        auVar242._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
        auVar242._8_4_ = auVar95._8_4_ ^ 0xffffffff;
        auVar242._12_4_ = auVar95._12_4_ ^ 0xffffffff;
        auVar242._16_4_ = auVar95._16_4_ ^ 0xffffffff;
        auVar242._20_4_ = auVar95._20_4_ ^ 0xffffffff;
        auVar242._24_4_ = auVar95._24_4_ ^ 0xffffffff;
        auVar242._28_4_ = auVar95._28_4_ ^ 0xffffffff;
        auVar95 = vorps_avx(auVar14,auVar242);
        auVar95 = vandps_avx(auVar212,auVar95);
      }
    }
    auVar386 = ZEXT3264(local_960);
    auVar345 = ZEXT3264(local_b00);
    auVar107 = local_520 & auVar95;
    auVar272 = ZEXT3264(local_9a0);
    fVar309 = (float)local_8a0._0_4_;
    fVar364 = (float)local_8a0._4_4_;
    fVar172 = fStack_898;
    fVar173 = fStack_894;
    fVar174 = fStack_890;
    fVar175 = fStack_88c;
    fVar176 = fStack_888;
    fVar258 = fStack_884;
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0x7f,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar107 >> 0xbf,0) == '\0') &&
        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar107[0x1f])
    {
      auVar331 = ZEXT3264(local_a20);
    }
    else {
      fStack_5c4 = auVar10._28_4_ + auVar196._28_4_;
      auVar386 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar181 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar181 = vshufps_avx(auVar181,auVar181,0);
      auVar236._16_16_ = auVar181;
      auVar236._0_16_ = auVar181;
      auVar14 = vminps_avx(auVar236,auVar166);
      auVar104._0_4_ =
           (float)local_a80._0_4_ * fVar352 +
           (float)local_6e0._0_4_ * fVar338 + (float)local_880._0_4_ * fVar365;
      auVar104._4_4_ =
           (float)local_a80._4_4_ * fVar358 +
           (float)local_6e0._4_4_ * fVar346 + (float)local_880._4_4_ * fVar370;
      auVar104._8_4_ = fStack_a78 * fVar359 + fStack_6d8 * fVar347 + fStack_878 * fVar372;
      auVar104._12_4_ = fStack_a74 * fVar360 + fStack_6d4 * fVar348 + fStack_874 * fVar374;
      auVar104._16_4_ = fStack_a70 * fVar361 + fStack_6d0 * fVar349 + fStack_870 * fVar376;
      auVar104._20_4_ = fStack_a6c * fVar362 + fStack_6cc * fVar350 + fStack_86c * fVar378;
      auVar104._24_4_ = fStack_a68 * fVar363 + fStack_6c8 * fVar351 + fStack_868 * fVar380;
      auVar104._28_4_ = fVar382 + auVar340._28_4_ + fVar382;
      auVar212 = vrcpps_avx(auVar104);
      fVar382 = auVar212._0_4_;
      fVar276 = auVar212._4_4_;
      auVar48._4_4_ = auVar104._4_4_ * fVar276;
      auVar48._0_4_ = auVar104._0_4_ * fVar382;
      fVar280 = auVar212._8_4_;
      auVar48._8_4_ = auVar104._8_4_ * fVar280;
      fVar284 = auVar212._12_4_;
      auVar48._12_4_ = auVar104._12_4_ * fVar284;
      fVar288 = auVar212._16_4_;
      auVar48._16_4_ = auVar104._16_4_ * fVar288;
      fVar292 = auVar212._20_4_;
      auVar48._20_4_ = auVar104._20_4_ * fVar292;
      fVar296 = auVar212._24_4_;
      auVar48._24_4_ = auVar104._24_4_ * fVar296;
      auVar48._28_4_ = auVar95._28_4_ + auVar181._12_4_;
      auVar330._8_4_ = 0x3f800000;
      auVar330._0_8_ = 0x3f8000003f800000;
      auVar330._12_4_ = 0x3f800000;
      auVar330._16_4_ = 0x3f800000;
      auVar330._20_4_ = 0x3f800000;
      auVar330._24_4_ = 0x3f800000;
      auVar330._28_4_ = 0x3f800000;
      auVar213 = vsubps_avx(auVar330,auVar48);
      auVar269._8_4_ = 0x7fffffff;
      auVar269._0_8_ = 0x7fffffff7fffffff;
      auVar269._12_4_ = 0x7fffffff;
      auVar269._16_4_ = 0x7fffffff;
      auVar269._20_4_ = 0x7fffffff;
      auVar269._24_4_ = 0x7fffffff;
      auVar269._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar104,auVar269);
      auVar306._8_4_ = 0x219392ef;
      auVar306._0_8_ = 0x219392ef219392ef;
      auVar306._12_4_ = 0x219392ef;
      auVar306._16_4_ = 0x219392ef;
      auVar306._20_4_ = 0x219392ef;
      auVar306._24_4_ = 0x219392ef;
      auVar306._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar107,auVar306,1);
      auVar49._4_4_ =
           (fVar276 + fVar276 * auVar213._4_4_) *
           -(fVar281 * fVar358 + fVar346 * fVar245 + fVar332 * fVar370);
      auVar49._0_4_ =
           (fVar382 + fVar382 * auVar213._0_4_) *
           -(fVar255 * fVar352 + fVar338 * fVar314 + fVar327 * fVar365);
      auVar49._8_4_ =
           (fVar280 + fVar280 * auVar213._8_4_) *
           -(fVar293 * fVar359 + fVar347 * fVar251 + fVar333 * fVar372);
      auVar49._12_4_ =
           (fVar284 + fVar284 * auVar213._12_4_) *
           -(fVar224 * fVar360 + fVar348 * fVar222 + fVar334 * fVar374);
      auVar49._16_4_ =
           (fVar288 + fVar288 * auVar213._16_4_) *
           -(fVar254 * fVar361 + fVar349 * fVar252 + fVar335 * fVar376);
      auVar49._20_4_ =
           (fVar292 + fVar292 * auVar213._20_4_) *
           -(fVar290 * fVar362 + fVar350 * fVar286 + fVar336 * fVar378);
      auVar49._24_4_ =
           (fVar296 + fVar296 * auVar213._24_4_) *
           -(fVar322 * fVar363 + fVar351 * fVar321 + fVar337 * fVar380);
      auVar49._28_4_ = auVar212._28_4_ + auVar213._28_4_;
      auVar107 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,1);
      auVar107 = vorps_avx(auVar10,auVar107);
      auVar325._8_4_ = 0xff800000;
      auVar325._0_8_ = 0xff800000ff800000;
      auVar325._12_4_ = 0xff800000;
      auVar325._16_4_ = 0xff800000;
      auVar325._20_4_ = 0xff800000;
      auVar325._24_4_ = 0xff800000;
      auVar325._28_4_ = 0xff800000;
      auVar107 = vblendvps_avx(auVar49,auVar325,auVar107);
      auVar212 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,6);
      auVar10 = vorps_avx(auVar10,auVar212);
      auVar356._8_4_ = 0x7f800000;
      auVar356._0_8_ = 0x7f8000007f800000;
      auVar356._12_4_ = 0x7f800000;
      auVar356._16_4_ = 0x7f800000;
      auVar356._20_4_ = 0x7f800000;
      auVar356._24_4_ = 0x7f800000;
      auVar356._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar49,auVar356,auVar10);
      auVar212 = vmaxps_avx(local_3e0,local_940);
      auVar212 = vmaxps_avx(auVar212,auVar107);
      auVar14 = vminps_avx(auVar14,auVar10);
      auVar213 = ZEXT832(0) << 0x20;
      auVar107 = vsubps_avx(auVar213,auVar11);
      auVar10 = vsubps_avx(auVar213,auVar12);
      auVar50._4_4_ = auVar10._4_4_ * -fVar114;
      auVar50._0_4_ = auVar10._0_4_ * -fVar83;
      auVar50._8_4_ = auVar10._8_4_ * -fVar116;
      auVar50._12_4_ = auVar10._12_4_ * -fVar118;
      auVar50._16_4_ = auVar10._16_4_ * -fVar119;
      auVar50._20_4_ = auVar10._20_4_ * -fVar120;
      auVar50._24_4_ = auVar10._24_4_ * -fVar121;
      auVar50._28_4_ = auVar10._28_4_;
      auVar51._4_4_ = fVar277 * auVar107._4_4_;
      auVar51._0_4_ = fVar313 * auVar107._0_4_;
      auVar51._8_4_ = fVar289 * auVar107._8_4_;
      auVar51._12_4_ = fVar221 * auVar107._12_4_;
      auVar51._16_4_ = fVar250 * auVar107._16_4_;
      auVar51._20_4_ = fVar282 * auVar107._20_4_;
      auVar51._24_4_ = fVar388 * auVar107._24_4_;
      auVar51._28_4_ = auVar107._28_4_;
      auVar107 = vsubps_avx(auVar50,auVar51);
      auVar10 = vsubps_avx(auVar213,auVar13);
      auVar52._4_4_ = fVar371 * auVar10._4_4_;
      auVar52._0_4_ = fVar366 * auVar10._0_4_;
      auVar52._8_4_ = fVar373 * auVar10._8_4_;
      auVar52._12_4_ = fVar375 * auVar10._12_4_;
      auVar52._16_4_ = fVar377 * auVar10._16_4_;
      auVar52._20_4_ = fVar379 * auVar10._20_4_;
      uVar1 = auVar10._28_4_;
      auVar52._24_4_ = fVar381 * auVar10._24_4_;
      auVar52._28_4_ = uVar1;
      auVar11 = vsubps_avx(auVar107,auVar52);
      auVar53._4_4_ = (float)local_880._4_4_ * -fVar114;
      auVar53._0_4_ = (float)local_880._0_4_ * -fVar83;
      auVar53._8_4_ = fStack_878 * -fVar116;
      auVar53._12_4_ = fStack_874 * -fVar118;
      auVar53._16_4_ = fStack_870 * -fVar119;
      auVar53._20_4_ = fStack_86c * -fVar120;
      auVar53._24_4_ = fStack_868 * -fVar121;
      auVar53._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar54._4_4_ = (float)local_6e0._4_4_ * fVar277;
      auVar54._0_4_ = (float)local_6e0._0_4_ * fVar313;
      auVar54._8_4_ = fStack_6d8 * fVar289;
      auVar54._12_4_ = fStack_6d4 * fVar221;
      auVar54._16_4_ = fStack_6d0 * fVar250;
      auVar54._20_4_ = fStack_6cc * fVar282;
      auVar54._24_4_ = fStack_6c8 * fVar388;
      auVar54._28_4_ = uVar1;
      auVar341._8_4_ = 0x3f800000;
      auVar341._0_8_ = 0x3f8000003f800000;
      auVar341._12_4_ = 0x3f800000;
      auVar341._16_4_ = 0x3f800000;
      auVar341._20_4_ = 0x3f800000;
      auVar341._24_4_ = 0x3f800000;
      auVar341._28_4_ = 0x3f800000;
      auVar107 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = (float)local_a80._4_4_ * fVar371;
      auVar55._0_4_ = (float)local_a80._0_4_ * fVar366;
      auVar55._8_4_ = fStack_a78 * fVar373;
      auVar55._12_4_ = fStack_a74 * fVar375;
      auVar55._16_4_ = fStack_a70 * fVar377;
      auVar55._20_4_ = fStack_a6c * fVar379;
      auVar55._24_4_ = fStack_a68 * fVar381;
      auVar55._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar107,auVar55);
      auVar107 = vrcpps_avx(auVar12);
      fVar313 = auVar107._0_4_;
      auVar237._0_4_ = auVar12._0_4_ * fVar313;
      fVar314 = auVar107._4_4_;
      auVar237._4_4_ = auVar12._4_4_ * fVar314;
      fVar255 = auVar107._8_4_;
      auVar237._8_4_ = auVar12._8_4_ * fVar255;
      fVar277 = auVar107._12_4_;
      auVar237._12_4_ = auVar12._12_4_ * fVar277;
      fVar245 = auVar107._16_4_;
      auVar237._16_4_ = auVar12._16_4_ * fVar245;
      fVar281 = auVar107._20_4_;
      auVar237._20_4_ = auVar12._20_4_ * fVar281;
      fVar289 = auVar107._24_4_;
      auVar237._24_4_ = auVar12._24_4_ * fVar289;
      auVar237._28_4_ = 0;
      auVar13 = vsubps_avx(auVar341,auVar237);
      auVar105._8_4_ = 0x7fffffff;
      auVar105._0_8_ = 0x7fffffff7fffffff;
      auVar105._12_4_ = 0x7fffffff;
      auVar105._16_4_ = 0x7fffffff;
      auVar105._20_4_ = 0x7fffffff;
      auVar105._24_4_ = 0x7fffffff;
      auVar105._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar12,auVar105);
      auVar10 = vcmpps_avx(auVar107,auVar306,1);
      auVar56._4_4_ = (fVar314 + fVar314 * auVar13._4_4_) * -auVar11._4_4_;
      auVar56._0_4_ = (fVar313 + fVar313 * auVar13._0_4_) * -auVar11._0_4_;
      auVar56._8_4_ = (fVar255 + fVar255 * auVar13._8_4_) * -auVar11._8_4_;
      auVar56._12_4_ = (fVar277 + fVar277 * auVar13._12_4_) * -auVar11._12_4_;
      auVar56._16_4_ = (fVar245 + fVar245 * auVar13._16_4_) * -auVar11._16_4_;
      auVar56._20_4_ = (fVar281 + fVar281 * auVar13._20_4_) * -auVar11._20_4_;
      auVar56._24_4_ = (fVar289 + fVar289 * auVar13._24_4_) * -auVar11._24_4_;
      auVar56._28_4_ = auVar11._28_4_ ^ 0x80000000;
      auVar107 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,1);
      auVar107 = vorps_avx(auVar10,auVar107);
      auVar107 = vblendvps_avx(auVar56,auVar325,auVar107);
      local_700 = vmaxps_avx(auVar212,auVar107);
      auVar107 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,6);
      auVar107 = vorps_avx(auVar10,auVar107);
      auVar107 = vblendvps_avx(auVar56,auVar356,auVar107);
      auVar95 = vandps_avx(local_520,auVar95);
      local_480 = vminps_avx(auVar14,auVar107);
      auVar107 = vcmpps_avx(local_700,local_480,2);
      auVar10 = auVar95 & auVar107;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar10 = vminps_avx(auVar268,auVar165);
        auVar11 = vminps_avx(local_640,local_660);
        auVar10 = vminps_avx(auVar10,auVar11);
        auVar10 = vsubps_avx(auVar10,local_2e0);
        auVar95 = vandps_avx(auVar107,auVar95);
        auVar71._4_4_ = fStack_43c;
        auVar71._0_4_ = local_440;
        auVar71._8_4_ = fStack_438;
        auVar71._12_4_ = fStack_434;
        auVar71._16_4_ = fStack_430;
        auVar71._20_4_ = fStack_42c;
        auVar71._24_4_ = fStack_428;
        auVar71._28_4_ = fStack_424;
        auVar107 = vminps_avx(auVar71,auVar341);
        auVar209 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar82 + fVar122 * (auVar107._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar113 + fVar153 * (auVar107._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar115 + fVar154 * (auVar107._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar117 + fVar155 * (auVar107._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar82 + fVar122 * (auVar107._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar113 + fVar153 * (auVar107._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar115 + fVar154 * (auVar107._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar117 + auVar107._28_4_ + 7.0;
        auVar72._4_4_ = fStack_41c;
        auVar72._0_4_ = local_420;
        auVar72._8_4_ = fStack_418;
        auVar72._12_4_ = fStack_414;
        auVar72._16_4_ = fStack_410;
        auVar72._20_4_ = fStack_40c;
        auVar72._24_4_ = fStack_408;
        auVar72._28_4_ = fStack_404;
        auVar107 = vminps_avx(auVar72,auVar341);
        auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar82 + fVar122 * (auVar107._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar113 + fVar153 * (auVar107._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar115 + fVar154 * (auVar107._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar117 + fVar155 * (auVar107._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar82 + fVar122 * (auVar107._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar113 + fVar153 * (auVar107._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar115 + fVar154 * (auVar107._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar117 + auVar107._28_4_ + 7.0;
        auVar57._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar57._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar57._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar57._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar57._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar57._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar57._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar57._28_4_ = 0x3f7ffffc;
        auVar107 = vmaxps_avx(ZEXT832(0) << 0x20,auVar57);
        auVar58._4_4_ = auVar107._4_4_ * auVar107._4_4_;
        auVar58._0_4_ = auVar107._0_4_ * auVar107._0_4_;
        auVar58._8_4_ = auVar107._8_4_ * auVar107._8_4_;
        auVar58._12_4_ = auVar107._12_4_ * auVar107._12_4_;
        auVar58._16_4_ = auVar107._16_4_ * auVar107._16_4_;
        auVar58._20_4_ = auVar107._20_4_ * auVar107._20_4_;
        auVar58._24_4_ = auVar107._24_4_ * auVar107._24_4_;
        auVar58._28_4_ = auVar107._28_4_;
        local_ac0 = vsubps_avx(local_680,auVar58);
        auVar59._4_4_ = local_ac0._4_4_ * (float)local_6c0._4_4_;
        auVar59._0_4_ = local_ac0._0_4_ * (float)local_6c0._0_4_;
        auVar59._8_4_ = local_ac0._8_4_ * fStack_6b8;
        auVar59._12_4_ = local_ac0._12_4_ * fStack_6b4;
        auVar59._16_4_ = local_ac0._16_4_ * fStack_6b0;
        auVar59._20_4_ = local_ac0._20_4_ * fStack_6ac;
        auVar59._24_4_ = local_ac0._24_4_ * fStack_6a8;
        auVar59._28_4_ = auVar107._28_4_;
        auVar10 = vsubps_avx(local_6a0,auVar59);
        auVar107 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) {
          auVar263 = ZEXT828(0) << 0x20;
          auVar231 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar387 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_b20 = ZEXT832(0) << 0x20;
          _local_c80 = local_b20._0_28_;
          auVar307._8_4_ = 0x7f800000;
          auVar307._0_8_ = 0x7f8000007f800000;
          auVar307._12_4_ = 0x7f800000;
          auVar307._16_4_ = 0x7f800000;
          auVar307._20_4_ = 0x7f800000;
          auVar307._24_4_ = 0x7f800000;
          auVar307._28_4_ = 0x7f800000;
          auVar342._8_4_ = 0xff800000;
          auVar342._0_8_ = 0xff800000ff800000;
          auVar342._12_4_ = 0xff800000;
          auVar342._16_4_ = 0xff800000;
          auVar342._20_4_ = 0xff800000;
          auVar342._24_4_ = 0xff800000;
          auVar342._28_4_ = 0xff800000;
          local_ac0 = auVar22;
        }
        else {
          auVar11 = vrcpps_avx(local_360);
          fVar313 = auVar11._0_4_;
          auVar214._0_4_ = local_360._0_4_ * fVar313;
          fVar314 = auVar11._4_4_;
          auVar214._4_4_ = local_360._4_4_ * fVar314;
          fVar255 = auVar11._8_4_;
          auVar214._8_4_ = local_360._8_4_ * fVar255;
          fVar277 = auVar11._12_4_;
          auVar214._12_4_ = local_360._12_4_ * fVar277;
          fVar245 = auVar11._16_4_;
          auVar214._16_4_ = local_360._16_4_ * fVar245;
          fVar281 = auVar11._20_4_;
          auVar214._20_4_ = local_360._20_4_ * fVar281;
          fVar289 = auVar11._24_4_;
          auVar214._24_4_ = local_360._24_4_ * fVar289;
          auVar214._28_4_ = 0;
          auVar13 = vsubps_avx(auVar341,auVar214);
          auVar12 = vsqrtps_avx(auVar10);
          fVar313 = fVar313 + fVar313 * auVar13._0_4_;
          fVar314 = fVar314 + fVar314 * auVar13._4_4_;
          fVar255 = fVar255 + fVar255 * auVar13._8_4_;
          fVar277 = fVar277 + fVar277 * auVar13._12_4_;
          fVar245 = fVar245 + fVar245 * auVar13._16_4_;
          fVar281 = fVar281 + fVar281 * auVar13._20_4_;
          fVar289 = fVar289 + fVar289 * auVar13._24_4_;
          auVar212 = vsubps_avx(local_340,auVar12);
          fVar254 = auVar212._0_4_ * fVar313;
          fVar282 = auVar212._4_4_ * fVar314;
          auVar60._4_4_ = fVar282;
          auVar60._0_4_ = fVar254;
          fVar286 = auVar212._8_4_ * fVar255;
          auVar60._8_4_ = fVar286;
          fVar290 = auVar212._12_4_ * fVar277;
          auVar60._12_4_ = fVar290;
          fVar388 = auVar212._16_4_ * fVar245;
          auVar60._16_4_ = fVar388;
          fVar321 = auVar212._20_4_ * fVar281;
          auVar60._20_4_ = fVar321;
          fVar322 = auVar212._24_4_ * fVar289;
          auVar60._24_4_ = fVar322;
          auVar60._28_4_ = fStack_864;
          auVar212 = vsubps_avx(auVar12,local_9e0);
          fVar313 = auVar212._0_4_ * fVar313;
          fVar314 = auVar212._4_4_ * fVar314;
          auVar61._4_4_ = fVar314;
          auVar61._0_4_ = fVar313;
          fVar255 = auVar212._8_4_ * fVar255;
          auVar61._8_4_ = fVar255;
          fVar277 = auVar212._12_4_ * fVar277;
          auVar61._12_4_ = fVar277;
          fVar245 = auVar212._16_4_ * fVar245;
          auVar61._16_4_ = fVar245;
          fVar281 = auVar212._20_4_ * fVar281;
          auVar61._20_4_ = fVar281;
          fVar289 = auVar212._24_4_ * fVar289;
          auVar61._24_4_ = fVar289;
          auVar61._28_4_ = fVar155;
          fVar251 = (fVar254 * local_580._0_4_ + local_600._0_4_) * local_5e0;
          fVar293 = (fVar282 * local_580._4_4_ + local_600._4_4_) * fStack_5dc;
          fVar221 = (fVar286 * local_580._8_4_ + local_600._8_4_) * fStack_5d8;
          fVar222 = (fVar290 * local_580._12_4_ + local_600._12_4_) * fStack_5d4;
          fVar224 = (fVar388 * local_580._16_4_ + local_600._16_4_) * fStack_5d0;
          fVar250 = (fVar321 * local_580._20_4_ + local_600._20_4_) * fStack_5cc;
          fVar252 = (fVar322 * local_580._24_4_ + local_600._24_4_) * fStack_5c8;
          auVar167._0_4_ = fVar257 + fVar251 * fVar312;
          auVar167._4_4_ = fVar275 + fVar293 * fVar243;
          auVar167._8_4_ = fVar279 + fVar221 * fVar249;
          auVar167._12_4_ = fVar283 + fVar222 * fVar220;
          auVar167._16_4_ = fVar287 + fVar224 * fVar248;
          auVar167._20_4_ = fVar291 + fVar250 * fVar278;
          auVar167._24_4_ = fVar295 + fVar252 * fVar17;
          auVar167._28_4_ = fVar297 + auVar11._28_4_ + auVar13._28_4_ + local_600._28_4_;
          auVar62._4_4_ = fVar282 * (float)local_a80._4_4_;
          auVar62._0_4_ = fVar254 * (float)local_a80._0_4_;
          auVar62._8_4_ = fVar286 * fStack_a78;
          auVar62._12_4_ = fVar290 * fStack_a74;
          auVar62._16_4_ = fVar388 * fStack_a70;
          auVar62._20_4_ = fVar321 * fStack_a6c;
          auVar62._24_4_ = fVar322 * fStack_a68;
          auVar62._28_4_ = auVar12._28_4_;
          local_980 = vsubps_avx(auVar62,auVar167);
          auVar238._0_4_ = (float)local_a60._0_4_ + fVar251 * fVar310;
          auVar238._4_4_ = local_a60._4_4_ + fVar293 * fVar223;
          auVar238._8_4_ = local_a60._8_4_ + fVar221 * fVar247;
          auVar238._12_4_ = local_a60._12_4_ + fVar222 * fVar253;
          auVar238._16_4_ = local_a60._16_4_ + fVar224 * fVar244;
          auVar238._20_4_ = local_a60._20_4_ + fVar250 * fVar256;
          auVar238._24_4_ = local_a60._24_4_ + fVar252 * fVar294;
          auVar238._28_4_ = local_a60._28_4_ + auVar12._28_4_;
          auVar63._4_4_ = (float)local_6e0._4_4_ * fVar282;
          auVar63._0_4_ = (float)local_6e0._0_4_ * fVar254;
          auVar63._8_4_ = fStack_6d8 * fVar286;
          auVar63._12_4_ = fStack_6d4 * fVar290;
          auVar63._16_4_ = fStack_6d0 * fVar388;
          auVar63._20_4_ = fStack_6cc * fVar321;
          auVar63._24_4_ = fStack_6c8 * fVar322;
          auVar63._28_4_ = 0x3e000000;
          auVar11 = vsubps_avx(auVar63,auVar238);
          _local_c80 = auVar11._0_28_;
          auVar215._0_4_ = local_300._0_4_ + fVar311 * fVar251;
          auVar215._4_4_ = local_300._4_4_ + fVar273 * fVar293;
          auVar215._8_4_ = local_300._8_4_ + fVar285 * fVar221;
          auVar215._12_4_ = local_300._12_4_ + fVar219 * fVar222;
          auVar215._16_4_ = local_300._16_4_ + fVar246 * fVar224;
          auVar215._20_4_ = local_300._20_4_ + fVar274 * fVar250;
          auVar215._24_4_ = local_300._24_4_ + fVar16 * fVar252;
          auVar215._28_4_ = local_300._28_4_ + auVar212._28_4_;
          auVar64._4_4_ = fVar282 * (float)local_880._4_4_;
          auVar64._0_4_ = fVar254 * (float)local_880._0_4_;
          auVar64._8_4_ = fVar286 * fStack_878;
          auVar64._12_4_ = fVar290 * fStack_874;
          auVar64._16_4_ = fVar388 * fStack_870;
          auVar64._20_4_ = fVar321 * fStack_86c;
          auVar64._24_4_ = fVar322 * fStack_868;
          auVar64._28_4_ = auVar238._28_4_;
          _local_b20 = vsubps_avx(auVar64,auVar215);
          fVar251 = (fVar313 * local_580._0_4_ + local_600._0_4_) * local_5e0;
          fVar293 = (fVar314 * local_580._4_4_ + local_600._4_4_) * fStack_5dc;
          fVar221 = (fVar255 * local_580._8_4_ + local_600._8_4_) * fStack_5d8;
          fVar222 = (fVar277 * local_580._12_4_ + local_600._12_4_) * fStack_5d4;
          fVar224 = (fVar245 * local_580._16_4_ + local_600._16_4_) * fStack_5d0;
          fVar250 = (fVar281 * local_580._20_4_ + local_600._20_4_) * fStack_5cc;
          fVar252 = (fVar289 * local_580._24_4_ + local_600._24_4_) * fStack_5c8;
          auVar216._0_4_ = fVar257 + fVar251 * fVar312;
          auVar216._4_4_ = fVar275 + fVar293 * fVar243;
          auVar216._8_4_ = fVar279 + fVar221 * fVar249;
          auVar216._12_4_ = fVar283 + fVar222 * fVar220;
          auVar216._16_4_ = fVar287 + fVar224 * fVar248;
          auVar216._20_4_ = fVar291 + fVar250 * fVar278;
          auVar216._24_4_ = fVar295 + fVar252 * fVar17;
          auVar216._28_4_ = fVar297 + local_b20._28_4_ + local_600._28_4_;
          auVar65._4_4_ = fVar314 * (float)local_a80._4_4_;
          auVar65._0_4_ = fVar313 * (float)local_a80._0_4_;
          auVar65._8_4_ = fVar255 * fStack_a78;
          auVar65._12_4_ = fVar277 * fStack_a74;
          auVar65._16_4_ = fVar245 * fStack_a70;
          auVar65._20_4_ = fVar281 * fStack_a6c;
          auVar65._24_4_ = fVar289 * fStack_a68;
          auVar65._28_4_ = 0x3e000000;
          auVar11 = vsubps_avx(auVar65,auVar216);
          auVar209 = auVar11._0_28_;
          auVar270._0_4_ = (float)local_a60._0_4_ + fVar251 * fVar310;
          auVar270._4_4_ = local_a60._4_4_ + fVar293 * fVar223;
          auVar270._8_4_ = local_a60._8_4_ + fVar221 * fVar247;
          auVar270._12_4_ = local_a60._12_4_ + fVar222 * fVar253;
          auVar270._16_4_ = local_a60._16_4_ + fVar224 * fVar244;
          auVar270._20_4_ = local_a60._20_4_ + fVar250 * fVar256;
          auVar270._24_4_ = local_a60._24_4_ + fVar252 * fVar294;
          auVar270._28_4_ = local_a60._28_4_ + 0.125;
          auVar66._4_4_ = (float)local_6e0._4_4_ * fVar314;
          auVar66._0_4_ = (float)local_6e0._0_4_ * fVar313;
          auVar66._8_4_ = fStack_6d8 * fVar255;
          auVar66._12_4_ = fStack_6d4 * fVar277;
          auVar66._16_4_ = fStack_6d0 * fVar245;
          auVar66._20_4_ = fStack_6cc * fVar281;
          auVar66._24_4_ = fStack_6c8 * fVar289;
          auVar66._28_4_ = fStack_a64;
          auVar11 = vsubps_avx(auVar66,auVar270);
          auVar263 = auVar11._0_28_;
          auVar239._0_4_ = local_300._0_4_ + fVar311 * fVar251;
          auVar239._4_4_ = local_300._4_4_ + fVar273 * fVar293;
          auVar239._8_4_ = local_300._8_4_ + fVar285 * fVar221;
          auVar239._12_4_ = local_300._12_4_ + fVar219 * fVar222;
          auVar239._16_4_ = local_300._16_4_ + fVar246 * fVar224;
          auVar239._20_4_ = local_300._20_4_ + fVar274 * fVar250;
          auVar239._24_4_ = local_300._24_4_ + fVar16 * fVar252;
          auVar239._28_4_ = local_300._28_4_ + auVar238._28_4_;
          auVar67._4_4_ = fVar314 * (float)local_880._4_4_;
          auVar67._0_4_ = fVar313 * (float)local_880._0_4_;
          auVar67._8_4_ = fVar255 * fStack_878;
          auVar67._12_4_ = fVar277 * fStack_874;
          auVar67._16_4_ = fVar245 * fStack_870;
          auVar67._20_4_ = fVar281 * fStack_86c;
          auVar67._24_4_ = fVar289 * fStack_868;
          auVar67._28_4_ = fStack_a64;
          auVar11 = vsubps_avx(auVar67,auVar239);
          auVar231 = auVar11._0_28_;
          auVar10 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,5);
          auVar308._8_4_ = 0x7f800000;
          auVar308._0_8_ = 0x7f8000007f800000;
          auVar308._12_4_ = 0x7f800000;
          auVar308._16_4_ = 0x7f800000;
          auVar308._20_4_ = 0x7f800000;
          auVar308._24_4_ = 0x7f800000;
          auVar308._28_4_ = 0x7f800000;
          auVar307 = vblendvps_avx(auVar308,auVar60,auVar10);
          auVar11 = vmaxps_avx(local_5c0,local_460);
          auVar68._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar68._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar68._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar68._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar68._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar68._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar68._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar68._28_4_ = auVar11._28_4_;
          auVar11 = vcmpps_avx(local_9c0,auVar68,1);
          auVar343._8_4_ = 0xff800000;
          auVar343._0_8_ = 0xff800000ff800000;
          auVar343._12_4_ = 0xff800000;
          auVar343._16_4_ = 0xff800000;
          auVar343._20_4_ = 0xff800000;
          auVar343._24_4_ = 0xff800000;
          auVar343._28_4_ = 0xff800000;
          auVar342 = vblendvps_avx(auVar343,auVar61,auVar10);
          auVar12 = auVar10 & auVar11;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            auVar107 = vandps_avx(auVar11,auVar10);
            auVar181 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
            auVar12 = vcmpps_avx(local_ac0,_DAT_01f7b000,2);
            auVar152._8_4_ = 0xff800000;
            auVar152._0_8_ = 0xff800000ff800000;
            auVar152._12_4_ = 0xff800000;
            auVar152._16_4_ = 0xff800000;
            auVar152._20_4_ = 0xff800000;
            auVar152._24_4_ = 0xff800000;
            auVar152._28_4_ = 0xff800000;
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar11 = vblendvps_avx(auVar171,auVar152,auVar12);
            auVar260 = vpmovsxwd_avx(auVar181);
            auVar181 = vpunpckhwd_avx(auVar181,auVar181);
            auVar385._16_16_ = auVar181;
            auVar385._0_16_ = auVar260;
            auVar307 = vblendvps_avx(auVar307,auVar11,auVar385);
            auVar11 = vblendvps_avx(auVar152,auVar171,auVar12);
            auVar342 = vblendvps_avx(auVar342,auVar11,auVar385);
            auVar198._0_8_ = auVar107._0_8_ ^ 0xffffffffffffffff;
            auVar198._8_4_ = auVar107._8_4_ ^ 0xffffffff;
            auVar198._12_4_ = auVar107._12_4_ ^ 0xffffffff;
            auVar198._16_4_ = auVar107._16_4_ ^ 0xffffffff;
            auVar198._20_4_ = auVar107._20_4_ ^ 0xffffffff;
            auVar198._24_4_ = auVar107._24_4_ ^ 0xffffffff;
            auVar198._28_4_ = auVar107._28_4_ ^ 0xffffffff;
            auVar107 = vorps_avx(auVar12,auVar198);
            auVar107 = vandps_avx(auVar10,auVar107);
          }
          auVar387 = local_980._0_28_;
        }
        _local_4e0 = local_700;
        local_4c0 = vminps_avx(local_480,auVar307);
        _local_800 = vmaxps_avx(local_700,auVar342);
        _local_4a0 = _local_800;
        auVar10 = vcmpps_avx(local_700,local_4c0,2);
        local_640 = vandps_avx(auVar95,auVar10);
        auVar10 = vcmpps_avx(_local_800,local_480,2);
        local_840 = vandps_avx(auVar95,auVar10);
        auVar95 = vorps_avx(local_840,local_640);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0x7f,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0xbf,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar95[0x1f] < '\0') {
          auStack_8bc = auVar268._4_28_;
          auVar144._0_8_ = auVar107._0_8_ ^ 0xffffffffffffffff;
          auVar144._8_4_ = auVar107._8_4_ ^ 0xffffffff;
          auVar144._12_4_ = auVar107._12_4_ ^ 0xffffffff;
          auVar144._16_4_ = auVar107._16_4_ ^ 0xffffffff;
          auVar144._20_4_ = auVar107._20_4_ ^ 0xffffffff;
          auVar144._24_4_ = auVar107._24_4_ ^ 0xffffffff;
          fVar309 = auVar107._28_4_;
          auVar144._28_4_ = (uint)fVar309 ^ 0xffffffff;
          auVar108._0_4_ =
               (float)local_a80._0_4_ * auVar209._0_4_ +
               (float)local_6e0._0_4_ * auVar263._0_4_ + (float)local_880._0_4_ * auVar231._0_4_;
          auVar108._4_4_ =
               (float)local_a80._4_4_ * auVar209._4_4_ +
               (float)local_6e0._4_4_ * auVar263._4_4_ + (float)local_880._4_4_ * auVar231._4_4_;
          auVar108._8_4_ =
               fStack_a78 * auVar209._8_4_ +
               fStack_6d8 * auVar263._8_4_ + fStack_878 * auVar231._8_4_;
          auVar108._12_4_ =
               fStack_a74 * auVar209._12_4_ +
               fStack_6d4 * auVar263._12_4_ + fStack_874 * auVar231._12_4_;
          auVar108._16_4_ =
               fStack_a70 * auVar209._16_4_ +
               fStack_6d0 * auVar263._16_4_ + fStack_870 * auVar231._16_4_;
          auVar108._20_4_ =
               fStack_a6c * auVar209._20_4_ +
               fStack_6cc * auVar263._20_4_ + fStack_86c * auVar231._20_4_;
          auVar108._24_4_ =
               fStack_a68 * auVar209._24_4_ +
               fStack_6c8 * auVar263._24_4_ + fStack_868 * auVar231._24_4_;
          auVar108._28_4_ = fVar309 + local_840._28_4_ + auVar95._28_4_;
          auVar217._8_4_ = 0x7fffffff;
          auVar217._0_8_ = 0x7fffffff7fffffff;
          auVar217._12_4_ = 0x7fffffff;
          auVar217._16_4_ = 0x7fffffff;
          auVar217._20_4_ = 0x7fffffff;
          auVar217._24_4_ = 0x7fffffff;
          auVar217._28_4_ = 0x7fffffff;
          auVar95 = vandps_avx(auVar108,auVar217);
          auVar240._8_4_ = 0x3e99999a;
          auVar240._0_8_ = 0x3e99999a3e99999a;
          auVar240._12_4_ = 0x3e99999a;
          auVar240._16_4_ = 0x3e99999a;
          auVar240._20_4_ = 0x3e99999a;
          auVar240._24_4_ = 0x3e99999a;
          auVar240._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar240,1);
          local_680 = vorps_avx(auVar95,auVar144);
          auVar109._0_4_ =
               auVar387._0_4_ * (float)local_a80._0_4_ +
               (float)local_6e0._0_4_ * (float)local_c80._0_4_ +
               (float)local_880._0_4_ * (float)local_b20._0_4_;
          auVar109._4_4_ =
               auVar387._4_4_ * (float)local_a80._4_4_ +
               (float)local_6e0._4_4_ * (float)local_c80._4_4_ +
               (float)local_880._4_4_ * (float)local_b20._4_4_;
          auVar109._8_4_ =
               auVar387._8_4_ * fStack_a78 + fStack_6d8 * fStack_c78 + fStack_878 * fStack_b18;
          auVar109._12_4_ =
               auVar387._12_4_ * fStack_a74 + fStack_6d4 * fStack_c74 + fStack_874 * fStack_b14;
          auVar109._16_4_ =
               auVar387._16_4_ * fStack_a70 + fStack_6d0 * fStack_c70 + fStack_870 * fStack_b10;
          auVar109._20_4_ =
               auVar387._20_4_ * fStack_a6c + fStack_6cc * fStack_c6c + fStack_86c * fStack_b0c;
          auVar109._24_4_ =
               auVar387._24_4_ * fStack_a68 + fStack_6c8 * fStack_c68 + fStack_868 * fStack_b08;
          auVar109._28_4_ = local_680._28_4_ + local_640._28_4_ + fVar309;
          auVar95 = vandps_avx(auVar109,auVar217);
          auVar95 = vcmpps_avx(auVar95,auVar240,1);
          auVar95 = vorps_avx(auVar95,auVar144);
          auVar145._8_4_ = 3;
          auVar145._0_8_ = 0x300000003;
          auVar145._12_4_ = 3;
          auVar145._16_4_ = 3;
          auVar145._20_4_ = 3;
          auVar145._24_4_ = 3;
          auVar145._28_4_ = 3;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar169,auVar145,auVar95);
          local_6a0 = ZEXT432(local_ca8);
          _local_6c0 = vpshufd_avx(ZEXT416(local_ca8),0);
          auVar181 = vpcmpgtd_avx(auVar95._16_16_,_local_6c0);
          auVar260 = vpcmpgtd_avx(auVar95._0_16_,_local_6c0);
          auVar146._16_16_ = auVar181;
          auVar146._0_16_ = auVar260;
          local_660 = vblendps_avx(ZEXT1632(auVar260),auVar146,0xf0);
          auVar95 = vandnps_avx(local_660,local_640);
          local_820._4_4_ = local_700._4_4_ + (float)local_8a0._4_4_;
          local_820._0_4_ = local_700._0_4_ + (float)local_8a0._0_4_;
          fStack_818 = local_700._8_4_ + fStack_898;
          fStack_814 = local_700._12_4_ + fStack_894;
          fStack_810 = local_700._16_4_ + fStack_890;
          fStack_80c = local_700._20_4_ + fStack_88c;
          fStack_808 = local_700._24_4_ + fStack_888;
          fStack_804 = local_700._28_4_ + fStack_884;
          while( true ) {
            local_500 = auVar95;
            local_b80 = auVar5._0_4_;
            fStack_b7c = auVar5._4_4_;
            fStack_b78 = auVar5._8_4_;
            fStack_b74 = auVar5._12_4_;
            local_b60 = auVar3._0_4_;
            fStack_b5c = auVar3._4_4_;
            fStack_b58 = auVar3._8_4_;
            fStack_b54 = auVar3._12_4_;
            local_b70 = auVar4._0_4_;
            fStack_b6c = auVar4._4_4_;
            fStack_b68 = auVar4._8_4_;
            fStack_b64 = auVar4._12_4_;
            local_b90 = auVar2._0_4_;
            fStack_b8c = auVar2._4_4_;
            fStack_b88 = auVar2._8_4_;
            fStack_b84 = auVar2._12_4_;
            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar95 >> 0x7f,0) == '\0') &&
                  (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0xbf,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar95[0x1f]) break;
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar147,local_700,auVar95);
            auVar10 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar10 = vminps_avx(auVar107,auVar10);
            auVar11 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar11 = vperm2f128_avx(auVar10,auVar10,1);
            auVar10 = vminps_avx(auVar10,auVar11);
            auVar107 = vcmpps_avx(auVar107,auVar10,0);
            auVar10 = auVar95 & auVar107;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar95 = vandps_avx(auVar107,auVar95);
            }
            uVar74 = vmovmskps_avx(auVar95);
            uVar80 = 0;
            if (uVar74 != 0) {
              for (; (uVar74 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
              }
            }
            uVar76 = (ulong)uVar80;
            *(undefined4 *)(local_500 + uVar76 * 4) = 0;
            fVar309 = local_1a0[uVar76];
            uVar80 = *(uint *)(local_4e0 + uVar76 * 4);
            fVar310 = auVar125._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              fVar310 = sqrtf((float)local_a00._0_4_);
            }
            auVar260 = vminps_avx(auVar3,auVar5);
            auVar181 = vmaxps_avx(auVar3,auVar5);
            auVar184 = vminps_avx(auVar4,auVar2);
            auVar87 = vminps_avx(auVar260,auVar184);
            auVar260 = vmaxps_avx(auVar4,auVar2);
            auVar184 = vmaxps_avx(auVar181,auVar260);
            auVar177._8_4_ = 0x7fffffff;
            auVar177._0_8_ = 0x7fffffff7fffffff;
            auVar177._12_4_ = 0x7fffffff;
            auVar181 = vandps_avx(auVar87,auVar177);
            auVar260 = vandps_avx(auVar184,auVar177);
            auVar181 = vmaxps_avx(auVar181,auVar260);
            auVar260 = vmovshdup_avx(auVar181);
            auVar260 = vmaxss_avx(auVar260,auVar181);
            auVar181 = vshufpd_avx(auVar181,auVar181,1);
            auVar181 = vmaxss_avx(auVar181,auVar260);
            local_a60._0_4_ = auVar181._0_4_ * 1.9073486e-06;
            local_ac0._0_4_ = fVar310 * 1.9073486e-06;
            local_9e0._0_16_ = vshufps_avx(auVar184,auVar184,0xff);
            auVar181 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar309),0x10);
            auVar272 = ZEXT1664(auVar181);
            lVar75 = 5;
            do {
              do {
                bVar81 = lVar75 == 0;
                lVar75 = lVar75 + -1;
                if (bVar81) goto LAB_009799d2;
                auVar260 = auVar272._0_16_;
                auVar181 = vmovshdup_avx(auVar260);
                fVar247 = auVar181._0_4_;
                fVar313 = 1.0 - fVar247;
                auVar181 = vshufps_avx(auVar260,auVar260,0x55);
                fVar309 = auVar181._0_4_;
                fVar310 = auVar181._4_4_;
                fVar311 = auVar181._8_4_;
                fVar312 = auVar181._12_4_;
                auVar181 = vshufps_avx(ZEXT416((uint)fVar313),ZEXT416((uint)fVar313),0);
                fVar314 = auVar181._0_4_;
                fVar255 = auVar181._4_4_;
                fVar223 = auVar181._8_4_;
                fVar273 = auVar181._12_4_;
                fVar243 = local_b70 * fVar309 + local_b80 * fVar314;
                fVar277 = fStack_b6c * fVar310 + fStack_b7c * fVar255;
                fVar245 = fStack_b68 * fVar311 + fStack_b78 * fVar223;
                fVar281 = fStack_b64 * fVar312 + fStack_b74 * fVar273;
                auVar226._0_4_ =
                     fVar314 * (local_b80 * fVar309 + fVar314 * local_b60) + fVar309 * fVar243;
                auVar226._4_4_ =
                     fVar255 * (fStack_b7c * fVar310 + fVar255 * fStack_b5c) + fVar310 * fVar277;
                auVar226._8_4_ =
                     fVar223 * (fStack_b78 * fVar311 + fVar223 * fStack_b58) + fVar311 * fVar245;
                auVar226._12_4_ =
                     fVar273 * (fStack_b74 * fVar312 + fVar273 * fStack_b54) + fVar312 * fVar281;
                auVar178._0_4_ =
                     fVar314 * fVar243 + fVar309 * (fVar309 * local_b90 + local_b70 * fVar314);
                auVar178._4_4_ =
                     fVar255 * fVar277 + fVar310 * (fVar310 * fStack_b8c + fStack_b6c * fVar255);
                auVar178._8_4_ =
                     fVar223 * fVar245 + fVar311 * (fVar311 * fStack_b88 + fStack_b68 * fVar223);
                auVar178._12_4_ =
                     fVar273 * fVar281 + fVar312 * (fVar312 * fStack_b84 + fStack_b64 * fVar273);
                auVar181 = vshufps_avx(auVar260,auVar260,0);
                auVar127._0_4_ = auVar181._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar127._4_4_ = auVar181._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar127._8_4_ = auVar181._8_4_ * fStack_9e8 + 0.0;
                auVar127._12_4_ = auVar181._12_4_ * fStack_9e4 + 0.0;
                auVar86._0_4_ = fVar314 * auVar226._0_4_ + fVar309 * auVar178._0_4_;
                auVar86._4_4_ = fVar255 * auVar226._4_4_ + fVar310 * auVar178._4_4_;
                auVar86._8_4_ = fVar223 * auVar226._8_4_ + fVar311 * auVar178._8_4_;
                auVar86._12_4_ = fVar273 * auVar226._12_4_ + fVar312 * auVar178._12_4_;
                local_980._0_16_ = auVar86;
                auVar181 = vsubps_avx(auVar127,auVar86);
                _local_b20 = auVar181;
                auVar181 = vdpps_avx(auVar181,auVar181,0x7f);
                fVar309 = auVar181._0_4_;
                if (fVar309 < 0.0) {
                  local_ae0._0_16_ = auVar178;
                  fVar310 = sqrtf(fVar309);
                  auVar272 = ZEXT1664(auVar260);
                  auVar178 = local_ae0._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar181,auVar181);
                  fVar310 = auVar184._0_4_;
                }
                auVar184 = vsubps_avx(auVar178,auVar226);
                auVar299._0_4_ = auVar184._0_4_ * 3.0;
                auVar299._4_4_ = auVar184._4_4_ * 3.0;
                auVar299._8_4_ = auVar184._8_4_ * 3.0;
                auVar299._12_4_ = auVar184._12_4_ * 3.0;
                auVar184 = vshufps_avx(ZEXT416((uint)(fVar247 * 6.0)),ZEXT416((uint)(fVar247 * 6.0))
                                       ,0);
                auVar87 = ZEXT416((uint)((fVar313 - (fVar247 + fVar247)) * 6.0));
                auVar156 = vshufps_avx(auVar87,auVar87,0);
                auVar87 = ZEXT416((uint)((fVar247 - (fVar313 + fVar313)) * 6.0));
                auVar84 = vshufps_avx(auVar87,auVar87,0);
                auVar123 = vshufps_avx(ZEXT416((uint)(fVar313 * 6.0)),ZEXT416((uint)(fVar313 * 6.0))
                                       ,0);
                auVar87 = vdpps_avx(auVar299,auVar299,0x7f);
                auVar128._0_4_ =
                     auVar123._0_4_ * local_b60 +
                     auVar84._0_4_ * local_b80 +
                     auVar184._0_4_ * local_b90 + auVar156._0_4_ * local_b70;
                auVar128._4_4_ =
                     auVar123._4_4_ * fStack_b5c +
                     auVar84._4_4_ * fStack_b7c +
                     auVar184._4_4_ * fStack_b8c + auVar156._4_4_ * fStack_b6c;
                auVar128._8_4_ =
                     auVar123._8_4_ * fStack_b58 +
                     auVar84._8_4_ * fStack_b78 +
                     auVar184._8_4_ * fStack_b88 + auVar156._8_4_ * fStack_b68;
                auVar128._12_4_ =
                     auVar123._12_4_ * fStack_b54 +
                     auVar84._12_4_ * fStack_b74 +
                     auVar184._12_4_ * fStack_b84 + auVar156._12_4_ * fStack_b64;
                auVar184 = vblendps_avx(auVar87,_DAT_01f45a50,0xe);
                auVar156 = vrsqrtss_avx(auVar184,auVar184);
                fVar312 = auVar156._0_4_;
                fVar311 = auVar87._0_4_;
                auVar156 = vdpps_avx(auVar299,auVar128,0x7f);
                auVar84 = vshufps_avx(auVar87,auVar87,0);
                auVar129._0_4_ = auVar128._0_4_ * auVar84._0_4_;
                auVar129._4_4_ = auVar128._4_4_ * auVar84._4_4_;
                auVar129._8_4_ = auVar128._8_4_ * auVar84._8_4_;
                auVar129._12_4_ = auVar128._12_4_ * auVar84._12_4_;
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar201._0_4_ = auVar299._0_4_ * auVar156._0_4_;
                auVar201._4_4_ = auVar299._4_4_ * auVar156._4_4_;
                auVar201._8_4_ = auVar299._8_4_ * auVar156._8_4_;
                auVar201._12_4_ = auVar299._12_4_ * auVar156._12_4_;
                auVar123 = vsubps_avx(auVar129,auVar201);
                auVar156 = vrcpss_avx(auVar184,auVar184);
                auVar184 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(auVar272._0_4_ * (float)local_ac0._0_4_)));
                auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar311 * auVar156._0_4_)));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                uVar76 = CONCAT44(auVar299._4_4_,auVar299._0_4_);
                auVar227._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar227._8_4_ = -auVar299._8_4_;
                auVar227._12_4_ = -auVar299._12_4_;
                auVar84 = ZEXT416((uint)(fVar312 * 1.5 +
                                        fVar311 * -0.5 * fVar312 * fVar312 * fVar312));
                auVar84 = vshufps_avx(auVar84,auVar84,0);
                auVar179._0_4_ = auVar84._0_4_ * auVar123._0_4_ * auVar156._0_4_;
                auVar179._4_4_ = auVar84._4_4_ * auVar123._4_4_ * auVar156._4_4_;
                auVar179._8_4_ = auVar84._8_4_ * auVar123._8_4_ * auVar156._8_4_;
                auVar179._12_4_ = auVar84._12_4_ * auVar123._12_4_ * auVar156._12_4_;
                auVar261._0_4_ = auVar299._0_4_ * auVar84._0_4_;
                auVar261._4_4_ = auVar299._4_4_ * auVar84._4_4_;
                auVar261._8_4_ = auVar299._8_4_ * auVar84._8_4_;
                auVar261._12_4_ = auVar299._12_4_ * auVar84._12_4_;
                if (fVar311 < 0.0) {
                  local_ae0._0_16_ = auVar227;
                  local_920._0_16_ = auVar261;
                  local_a40._0_16_ = auVar179;
                  fVar311 = sqrtf(fVar311);
                  auVar179 = local_a40._0_16_;
                  auVar227 = local_ae0._0_16_;
                  auVar261 = local_920._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar311 = auVar87._0_4_;
                }
                auVar87 = vdpps_avx(_local_b20,auVar261,0x7f);
                fVar310 = ((float)local_a60._0_4_ / fVar311) * (fVar310 + 1.0) +
                          auVar184._0_4_ + fVar310 * (float)local_a60._0_4_;
                auVar156 = vdpps_avx(auVar227,auVar261,0x7f);
                auVar84 = vdpps_avx(_local_b20,auVar179,0x7f);
                auVar123 = vdpps_avx(_local_9f0,auVar261,0x7f);
                auVar124 = vdpps_avx(_local_b20,auVar227,0x7f);
                fVar311 = auVar156._0_4_ + auVar84._0_4_;
                fVar312 = auVar87._0_4_;
                auVar88._0_4_ = fVar312 * fVar312;
                auVar88._4_4_ = auVar87._4_4_ * auVar87._4_4_;
                auVar88._8_4_ = auVar87._8_4_ * auVar87._8_4_;
                auVar88._12_4_ = auVar87._12_4_ * auVar87._12_4_;
                auVar84 = vsubps_avx(auVar181,auVar88);
                auVar156 = vdpps_avx(_local_b20,_local_9f0,0x7f);
                fVar313 = auVar124._0_4_ - fVar312 * fVar311;
                fVar314 = auVar156._0_4_ - fVar312 * auVar123._0_4_;
                auVar156 = vrsqrtss_avx(auVar84,auVar84);
                fVar255 = auVar84._0_4_;
                fVar312 = auVar156._0_4_;
                fVar312 = fVar312 * 1.5 + fVar255 * -0.5 * fVar312 * fVar312 * fVar312;
                if (fVar255 < 0.0) {
                  local_ae0._0_4_ = fVar310;
                  local_920._0_16_ = auVar123;
                  local_a40._0_16_ = ZEXT416((uint)fVar311);
                  local_7e0._0_4_ = fVar313;
                  local_940._0_4_ = fVar314;
                  local_9c0._0_4_ = fVar312;
                  fVar255 = sqrtf(fVar255);
                  fVar312 = (float)local_9c0._0_4_;
                  fVar313 = (float)local_7e0._0_4_;
                  fVar314 = (float)local_940._0_4_;
                  auVar123 = local_920._0_16_;
                  fVar310 = (float)local_ae0._0_4_;
                  auVar156 = local_a40._0_16_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar84,auVar84);
                  fVar255 = auVar156._0_4_;
                  auVar156 = ZEXT416((uint)fVar311);
                }
                auVar124 = vpermilps_avx(local_980._0_16_,0xff);
                auVar93 = vshufps_avx(auVar299,auVar299,0xff);
                fVar311 = fVar313 * fVar312 - auVar93._0_4_;
                auVar202._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                auVar202._8_4_ = auVar123._8_4_ ^ 0x80000000;
                auVar202._12_4_ = auVar123._12_4_ ^ 0x80000000;
                auVar228._0_4_ = -fVar311;
                auVar228._4_4_ = 0x80000000;
                auVar228._8_4_ = 0x80000000;
                auVar228._12_4_ = 0x80000000;
                auVar84 = vinsertps_avx(auVar228,ZEXT416((uint)(fVar314 * fVar312)),0x1c);
                auVar123 = vmovsldup_avx(ZEXT416((uint)(auVar156._0_4_ * fVar314 * fVar312 -
                                                       auVar123._0_4_ * fVar311)));
                auVar84 = vdivps_avx(auVar84,auVar123);
                auVar156 = vinsertps_avx(auVar156,auVar202,0x10);
                auVar156 = vdivps_avx(auVar156,auVar123);
                auVar123 = vmovsldup_avx(auVar87);
                auVar89 = ZEXT416((uint)(fVar255 - auVar124._0_4_));
                auVar124 = vmovsldup_avx(auVar89);
                auVar157._0_4_ = auVar123._0_4_ * auVar84._0_4_ + auVar124._0_4_ * auVar156._0_4_;
                auVar157._4_4_ = auVar123._4_4_ * auVar84._4_4_ + auVar124._4_4_ * auVar156._4_4_;
                auVar157._8_4_ = auVar123._8_4_ * auVar84._8_4_ + auVar124._8_4_ * auVar156._8_4_;
                auVar157._12_4_ =
                     auVar123._12_4_ * auVar84._12_4_ + auVar124._12_4_ * auVar156._12_4_;
                auVar156 = vsubps_avx(auVar260,auVar157);
                auVar272 = ZEXT1664(auVar156);
                auVar158._8_4_ = 0x7fffffff;
                auVar158._0_8_ = 0x7fffffff7fffffff;
                auVar158._12_4_ = 0x7fffffff;
                auVar260 = vandps_avx(auVar87,auVar158);
              } while (fVar310 <= auVar260._0_4_);
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar260 = vandps_avx(auVar89,auVar180);
            } while ((float)local_9e0._0_4_ * 1.9073486e-06 + auVar184._0_4_ + fVar310 <=
                     auVar260._0_4_);
            fVar310 = auVar156._0_4_ + (float)local_8f0._0_4_;
            if ((fVar298 <= fVar310) &&
               (fVar311 = *(float *)(ray + k * 4 + 0x80), fVar310 <= fVar311)) {
              auVar260 = vmovshdup_avx(auVar156);
              fVar312 = auVar260._0_4_;
              if ((0.0 <= fVar312) && (fVar312 <= 1.0)) {
                auVar181 = vrsqrtss_avx(auVar181,auVar181);
                fVar313 = auVar181._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar73].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar181 = ZEXT416((uint)(fVar313 * 1.5 +
                                           fVar309 * -0.5 * fVar313 * fVar313 * fVar313));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar182._0_4_ = auVar181._0_4_ * (float)local_b20._0_4_;
                  auVar182._4_4_ = auVar181._4_4_ * (float)local_b20._4_4_;
                  auVar182._8_4_ = auVar181._8_4_ * fStack_b18;
                  auVar182._12_4_ = auVar181._12_4_ * fStack_b14;
                  auVar130._0_4_ = auVar299._0_4_ + auVar93._0_4_ * auVar182._0_4_;
                  auVar130._4_4_ = auVar299._4_4_ + auVar93._4_4_ * auVar182._4_4_;
                  auVar130._8_4_ = auVar299._8_4_ + auVar93._8_4_ * auVar182._8_4_;
                  auVar130._12_4_ = auVar299._12_4_ + auVar93._12_4_ * auVar182._12_4_;
                  auVar181 = vshufps_avx(auVar182,auVar182,0xc9);
                  auVar260 = vshufps_avx(auVar299,auVar299,0xc9);
                  auVar183._0_4_ = auVar260._0_4_ * auVar182._0_4_;
                  auVar183._4_4_ = auVar260._4_4_ * auVar182._4_4_;
                  auVar183._8_4_ = auVar260._8_4_ * auVar182._8_4_;
                  auVar183._12_4_ = auVar260._12_4_ * auVar182._12_4_;
                  auVar203._0_4_ = auVar299._0_4_ * auVar181._0_4_;
                  auVar203._4_4_ = auVar299._4_4_ * auVar181._4_4_;
                  auVar203._8_4_ = auVar299._8_4_ * auVar181._8_4_;
                  auVar203._12_4_ = auVar299._12_4_ * auVar181._12_4_;
                  auVar184 = vsubps_avx(auVar203,auVar183);
                  auVar181 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar260 = vshufps_avx(auVar130,auVar130,0xc9);
                  auVar204._0_4_ = auVar260._0_4_ * auVar181._0_4_;
                  auVar204._4_4_ = auVar260._4_4_ * auVar181._4_4_;
                  auVar204._8_4_ = auVar260._8_4_ * auVar181._8_4_;
                  auVar204._12_4_ = auVar260._12_4_ * auVar181._12_4_;
                  auVar181 = vshufps_avx(auVar184,auVar184,0xd2);
                  auVar131._0_4_ = auVar130._0_4_ * auVar181._0_4_;
                  auVar131._4_4_ = auVar130._4_4_ * auVar181._4_4_;
                  auVar131._8_4_ = auVar130._8_4_ * auVar181._8_4_;
                  auVar131._12_4_ = auVar130._12_4_ * auVar181._12_4_;
                  auVar181 = vsubps_avx(auVar204,auVar131);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    uVar1 = vextractps_avx(auVar181,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar181,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar181._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar312;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(uint *)(ray + k * 4 + 0x110) = local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar73;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_770 = vshufps_avx(auVar156,auVar156,0x55);
                    auVar260 = vshufps_avx(auVar181,auVar181,0x55);
                    auStack_790 = vshufps_avx(auVar181,auVar181,0xaa);
                    local_780 = vshufps_avx(auVar181,auVar181,0);
                    local_7a0 = (RTCHitN  [16])auVar260;
                    local_760 = ZEXT816(0) << 0x20;
                    local_750 = local_7c0._0_8_;
                    uStack_748 = local_7c0._8_8_;
                    local_740 = local_7b0;
                    vcmpps_avx(ZEXT1632(local_7b0),ZEXT1632(local_7b0),0xf);
                    uStack_72c = context->user->instID[0];
                    local_730 = uStack_72c;
                    uStack_728 = uStack_72c;
                    uStack_724 = uStack_72c;
                    uVar80 = context->user->instPrimID[0];
                    auVar132._4_4_ = uVar80;
                    auVar132._0_4_ = uVar80;
                    auVar132._8_4_ = uVar80;
                    auVar132._12_4_ = uVar80;
                    auStack_720 = auVar132;
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    local_860._0_16_ = *local_a88;
                    local_b50.valid = (int *)local_860;
                    local_b50.geometryUserPtr = pGVar7->userPtr;
                    local_b50.context = context->user;
                    local_b50.hit = local_7a0;
                    local_b50.N = 4;
                    auVar181 = *local_a88;
                    local_b50.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_b50);
                      auVar331._8_56_ = extraout_var;
                      auVar331._0_8_ = extraout_XMM1_Qa;
                      auVar132 = auVar331._0_16_;
                      auVar181 = local_860._0_16_;
                    }
                    if (auVar181 == (undefined1  [16])0x0) {
                      auVar260 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar181 = vpcmpeqd_avx(auVar132,auVar132);
                      auVar260 = auVar260 ^ auVar181;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      auVar184 = vpcmpeqd_avx(auVar260,auVar260);
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_b50);
                        auVar184 = vpcmpeqd_avx(auVar184,auVar184);
                        auVar181 = local_860._0_16_;
                      }
                      auVar87 = vpcmpeqd_avx(auVar181,_DAT_01f45a50);
                      auVar260 = auVar87 ^ auVar184;
                      if (auVar181 != (undefined1  [16])0x0) {
                        auVar87 = auVar87 ^ auVar184;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])local_b50.hit);
                        *(undefined1 (*) [16])(local_b50.ray + 0xc0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x10));
                        *(undefined1 (*) [16])(local_b50.ray + 0xd0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x20));
                        *(undefined1 (*) [16])(local_b50.ray + 0xe0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x30));
                        *(undefined1 (*) [16])(local_b50.ray + 0xf0) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x40));
                        *(undefined1 (*) [16])(local_b50.ray + 0x100) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x50));
                        *(undefined1 (*) [16])(local_b50.ray + 0x110) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x60));
                        *(undefined1 (*) [16])(local_b50.ray + 0x120) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x70));
                        *(undefined1 (*) [16])(local_b50.ray + 0x130) = auVar181;
                        auVar181 = vmaskmovps_avx(auVar87,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x80));
                        *(undefined1 (*) [16])(local_b50.ray + 0x140) = auVar181;
                      }
                    }
                    auVar90._8_8_ = 0x100000001;
                    auVar90._0_8_ = 0x100000001;
                    if ((auVar90 & auVar260) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar311;
                    }
                  }
                }
              }
            }
LAB_009799d2:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar319._4_4_ = uVar1;
            auVar319._0_4_ = uVar1;
            auVar319._8_4_ = uVar1;
            auVar319._12_4_ = uVar1;
            auVar319._16_4_ = uVar1;
            auVar319._20_4_ = uVar1;
            auVar319._24_4_ = uVar1;
            auVar319._28_4_ = uVar1;
            auVar386 = ZEXT3264(auVar319);
            auVar95 = vcmpps_avx(_local_820,auVar319,2);
            auVar95 = vandps_avx(auVar95,local_500);
          }
          auVar110._0_4_ = (float)local_8a0._0_4_ + (float)local_800._0_4_;
          auVar110._4_4_ = (float)local_8a0._4_4_ + (float)local_800._4_4_;
          auVar110._8_4_ = fStack_898 + fStack_7f8;
          auVar110._12_4_ = fStack_894 + fStack_7f4;
          auVar110._16_4_ = fStack_890 + fStack_7f0;
          auVar110._20_4_ = fStack_88c + fStack_7ec;
          auVar110._24_4_ = fStack_888 + fStack_7e8;
          auVar110._28_4_ = fStack_884 + fStack_7e4;
          auVar181 = vshufps_avx(auVar386._0_16_,auVar386._0_16_,0);
          auVar148._16_16_ = auVar181;
          auVar148._0_16_ = auVar181;
          auVar95 = vcmpps_avx(auVar110,auVar148,2);
          _local_820 = vandps_avx(auVar95,local_840);
          auVar111._8_4_ = 3;
          auVar111._0_8_ = 0x300000003;
          auVar111._12_4_ = 3;
          auVar111._16_4_ = 3;
          auVar111._20_4_ = 3;
          auVar111._24_4_ = 3;
          auVar111._28_4_ = 3;
          auVar149._8_4_ = 2;
          auVar149._0_8_ = 0x200000002;
          auVar149._12_4_ = 2;
          auVar149._16_4_ = 2;
          auVar149._20_4_ = 2;
          auVar149._24_4_ = 2;
          auVar149._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar149,auVar111,local_680);
          auVar181 = vpcmpgtd_avx(auVar95._16_16_,_local_6c0);
          auVar260 = vpshufd_avx(local_6a0._0_16_,0);
          auVar260 = vpcmpgtd_avx(auVar95._0_16_,auVar260);
          auVar150._16_16_ = auVar181;
          auVar150._0_16_ = auVar260;
          local_840 = vblendps_avx(ZEXT1632(auVar260),auVar150,0xf0);
          local_860 = vandnps_avx(local_840,_local_820);
          local_700 = _local_4a0;
          local_800._4_4_ = (float)local_8a0._4_4_ + (float)local_4a0._4_4_;
          local_800._0_4_ = (float)local_8a0._0_4_ + (float)local_4a0._0_4_;
          fStack_7f8 = fStack_898 + fStack_498;
          fStack_7f4 = fStack_894 + fStack_494;
          fStack_7f0 = fStack_890 + fStack_490;
          fStack_7ec = fStack_88c + fStack_48c;
          fStack_7e8 = fStack_888 + fStack_488;
          fStack_7e4 = fStack_884 + fStack_484;
          auVar331 = ZEXT3264(local_a20);
          auVar345 = ZEXT3264(local_b00);
          auVar272 = ZEXT3264(local_9a0);
          for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_860 >> 0x7f,0) != '\0') ||
                   (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_860 >> 0xbf,0) != '\0') ||
                 (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar95,local_860)) {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar95 = vblendvps_avx(auVar151,local_700,local_860);
            auVar107 = vshufps_avx(auVar95,auVar95,0xb1);
            auVar107 = vminps_avx(auVar95,auVar107);
            auVar10 = vshufpd_avx(auVar107,auVar107,5);
            auVar107 = vminps_avx(auVar107,auVar10);
            auVar10 = vperm2f128_avx(auVar107,auVar107,1);
            auVar107 = vminps_avx(auVar107,auVar10);
            auVar107 = vcmpps_avx(auVar95,auVar107,0);
            auVar10 = local_860 & auVar107;
            auVar95 = local_860;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar95 = vandps_avx(auVar107,local_860);
            }
            uVar74 = vmovmskps_avx(auVar95);
            uVar80 = 0;
            if (uVar74 != 0) {
              for (; (uVar74 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
              }
            }
            uVar76 = (ulong)uVar80;
            *(undefined4 *)(local_860 + uVar76 * 4) = 0;
            fVar309 = local_1c0[uVar76];
            uVar80 = *(uint *)(local_480 + uVar76 * 4);
            fVar310 = auVar18._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              fVar310 = sqrtf((float)local_a00._0_4_);
              auVar272 = ZEXT3264(local_9a0);
              auVar345 = ZEXT3264(local_b00);
              auVar331 = ZEXT3264(local_a20);
            }
            auVar260 = vminps_avx(auVar3,auVar5);
            auVar181 = vmaxps_avx(auVar3,auVar5);
            auVar184 = vminps_avx(auVar4,auVar2);
            auVar87 = vminps_avx(auVar260,auVar184);
            auVar260 = vmaxps_avx(auVar4,auVar2);
            auVar184 = vmaxps_avx(auVar181,auVar260);
            auVar185._8_4_ = 0x7fffffff;
            auVar185._0_8_ = 0x7fffffff7fffffff;
            auVar185._12_4_ = 0x7fffffff;
            auVar181 = vandps_avx(auVar87,auVar185);
            auVar260 = vandps_avx(auVar184,auVar185);
            auVar181 = vmaxps_avx(auVar181,auVar260);
            auVar260 = vmovshdup_avx(auVar181);
            auVar260 = vmaxss_avx(auVar260,auVar181);
            auVar181 = vshufpd_avx(auVar181,auVar181,1);
            auVar181 = vmaxss_avx(auVar181,auVar260);
            local_a60._0_4_ = auVar181._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar310 * 1.9073486e-06;
            local_9e0._0_16_ = vshufps_avx(auVar184,auVar184,0xff);
            auVar181 = vinsertps_avx(ZEXT416(uVar80),ZEXT416((uint)fVar309),0x10);
            auVar386 = ZEXT1664(auVar181);
            lVar75 = 5;
            do {
              do {
                bVar81 = lVar75 == 0;
                lVar75 = lVar75 + -1;
                if (bVar81) goto LAB_0097a54a;
                auVar260 = auVar386._0_16_;
                auVar181 = vmovshdup_avx(auVar260);
                fVar247 = auVar181._0_4_;
                fVar313 = 1.0 - fVar247;
                auVar181 = vshufps_avx(auVar260,auVar260,0x55);
                fVar309 = auVar181._0_4_;
                fVar310 = auVar181._4_4_;
                fVar311 = auVar181._8_4_;
                fVar312 = auVar181._12_4_;
                auVar181 = vshufps_avx(ZEXT416((uint)fVar313),ZEXT416((uint)fVar313),0);
                fVar314 = auVar181._0_4_;
                fVar255 = auVar181._4_4_;
                fVar223 = auVar181._8_4_;
                fVar273 = auVar181._12_4_;
                fVar243 = local_b70 * fVar309 + local_b80 * fVar314;
                fVar277 = fStack_b6c * fVar310 + fStack_b7c * fVar255;
                fVar245 = fStack_b68 * fVar311 + fStack_b78 * fVar223;
                fVar281 = fStack_b64 * fVar312 + fStack_b74 * fVar273;
                auVar229._0_4_ =
                     fVar314 * (local_b80 * fVar309 + fVar314 * local_b60) + fVar309 * fVar243;
                auVar229._4_4_ =
                     fVar255 * (fStack_b7c * fVar310 + fVar255 * fStack_b5c) + fVar310 * fVar277;
                auVar229._8_4_ =
                     fVar223 * (fStack_b78 * fVar311 + fVar223 * fStack_b58) + fVar311 * fVar245;
                auVar229._12_4_ =
                     fVar273 * (fStack_b74 * fVar312 + fVar273 * fStack_b54) + fVar312 * fVar281;
                auVar186._0_4_ =
                     fVar314 * fVar243 + fVar309 * (fVar309 * local_b90 + local_b70 * fVar314);
                auVar186._4_4_ =
                     fVar255 * fVar277 + fVar310 * (fVar310 * fStack_b8c + fStack_b6c * fVar255);
                auVar186._8_4_ =
                     fVar223 * fVar245 + fVar311 * (fVar311 * fStack_b88 + fStack_b68 * fVar223);
                auVar186._12_4_ =
                     fVar273 * fVar281 + fVar312 * (fVar312 * fStack_b84 + fStack_b64 * fVar273);
                auVar181 = vshufps_avx(auVar260,auVar260,0);
                auVar133._0_4_ = auVar181._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar133._4_4_ = auVar181._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar133._8_4_ = auVar181._8_4_ * fStack_9e8 + 0.0;
                auVar133._12_4_ = auVar181._12_4_ * fStack_9e4 + 0.0;
                auVar91._0_4_ = fVar314 * auVar229._0_4_ + fVar309 * auVar186._0_4_;
                auVar91._4_4_ = fVar255 * auVar229._4_4_ + fVar310 * auVar186._4_4_;
                auVar91._8_4_ = fVar223 * auVar229._8_4_ + fVar311 * auVar186._8_4_;
                auVar91._12_4_ = fVar273 * auVar229._12_4_ + fVar312 * auVar186._12_4_;
                local_980._0_16_ = auVar91;
                auVar181 = vsubps_avx(auVar133,auVar91);
                _local_b20 = auVar181;
                auVar181 = vdpps_avx(auVar181,auVar181,0x7f);
                fVar309 = auVar181._0_4_;
                if (fVar309 < 0.0) {
                  local_ac0._0_16_ = auVar229;
                  fVar310 = sqrtf(fVar309);
                  auVar386 = ZEXT1664(auVar260);
                  auVar229 = local_ac0._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar181,auVar181);
                  fVar310 = auVar184._0_4_;
                }
                auVar184 = vsubps_avx(auVar186,auVar229);
                auVar262._0_4_ = auVar184._0_4_ * 3.0;
                auVar262._4_4_ = auVar184._4_4_ * 3.0;
                auVar262._8_4_ = auVar184._8_4_ * 3.0;
                auVar262._12_4_ = auVar184._12_4_ * 3.0;
                auVar184 = vshufps_avx(ZEXT416((uint)(fVar247 * 6.0)),ZEXT416((uint)(fVar247 * 6.0))
                                       ,0);
                auVar87 = ZEXT416((uint)((fVar313 - (fVar247 + fVar247)) * 6.0));
                auVar156 = vshufps_avx(auVar87,auVar87,0);
                auVar87 = ZEXT416((uint)((fVar247 - (fVar313 + fVar313)) * 6.0));
                auVar84 = vshufps_avx(auVar87,auVar87,0);
                auVar123 = vshufps_avx(ZEXT416((uint)(fVar313 * 6.0)),ZEXT416((uint)(fVar313 * 6.0))
                                       ,0);
                auVar87 = vdpps_avx(auVar262,auVar262,0x7f);
                auVar134._0_4_ =
                     auVar123._0_4_ * local_b60 +
                     auVar84._0_4_ * local_b80 +
                     auVar184._0_4_ * local_b90 + auVar156._0_4_ * local_b70;
                auVar134._4_4_ =
                     auVar123._4_4_ * fStack_b5c +
                     auVar84._4_4_ * fStack_b7c +
                     auVar184._4_4_ * fStack_b8c + auVar156._4_4_ * fStack_b6c;
                auVar134._8_4_ =
                     auVar123._8_4_ * fStack_b58 +
                     auVar84._8_4_ * fStack_b78 +
                     auVar184._8_4_ * fStack_b88 + auVar156._8_4_ * fStack_b68;
                auVar134._12_4_ =
                     auVar123._12_4_ * fStack_b54 +
                     auVar84._12_4_ * fStack_b74 +
                     auVar184._12_4_ * fStack_b84 + auVar156._12_4_ * fStack_b64;
                auVar184 = vblendps_avx(auVar87,_DAT_01f45a50,0xe);
                auVar156 = vrsqrtss_avx(auVar184,auVar184);
                fVar312 = auVar156._0_4_;
                fVar311 = auVar87._0_4_;
                auVar156 = vdpps_avx(auVar262,auVar134,0x7f);
                auVar84 = vshufps_avx(auVar87,auVar87,0);
                auVar135._0_4_ = auVar134._0_4_ * auVar84._0_4_;
                auVar135._4_4_ = auVar134._4_4_ * auVar84._4_4_;
                auVar135._8_4_ = auVar134._8_4_ * auVar84._8_4_;
                auVar135._12_4_ = auVar134._12_4_ * auVar84._12_4_;
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar205._0_4_ = auVar262._0_4_ * auVar156._0_4_;
                auVar205._4_4_ = auVar262._4_4_ * auVar156._4_4_;
                auVar205._8_4_ = auVar262._8_4_ * auVar156._8_4_;
                auVar205._12_4_ = auVar262._12_4_ * auVar156._12_4_;
                auVar123 = vsubps_avx(auVar135,auVar205);
                auVar156 = vrcpss_avx(auVar184,auVar184);
                auVar184 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(auVar386._0_4_ * (float)local_920._0_4_)));
                auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar311 * auVar156._0_4_)));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                uVar76 = CONCAT44(auVar262._4_4_,auVar262._0_4_);
                auVar315._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar315._8_4_ = -auVar262._8_4_;
                auVar315._12_4_ = -auVar262._12_4_;
                auVar84 = ZEXT416((uint)(fVar312 * 1.5 +
                                        fVar311 * -0.5 * fVar312 * fVar312 * fVar312));
                auVar84 = vshufps_avx(auVar84,auVar84,0);
                auVar187._0_4_ = auVar84._0_4_ * auVar123._0_4_ * auVar156._0_4_;
                auVar187._4_4_ = auVar84._4_4_ * auVar123._4_4_ * auVar156._4_4_;
                auVar187._8_4_ = auVar84._8_4_ * auVar123._8_4_ * auVar156._8_4_;
                auVar187._12_4_ = auVar84._12_4_ * auVar123._12_4_ * auVar156._12_4_;
                local_ae0._0_4_ = auVar262._0_4_ * auVar84._0_4_;
                local_ae0._4_4_ = auVar262._4_4_ * auVar84._4_4_;
                local_ae0._8_4_ = auVar262._8_4_ * auVar84._8_4_;
                local_ae0._12_4_ = auVar262._12_4_ * auVar84._12_4_;
                if (fVar311 < 0.0) {
                  local_ac0._0_4_ = fVar310;
                  local_a40._0_16_ = auVar187;
                  fVar311 = sqrtf(fVar311);
                  auVar187 = local_a40._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar311 = auVar87._0_4_;
                  local_ac0._0_4_ = fVar310;
                }
                auVar87 = vdpps_avx(_local_b20,local_ae0._0_16_,0x7f);
                fVar310 = ((float)local_a60._0_4_ / fVar311) * ((float)local_ac0._0_4_ + 1.0) +
                          auVar184._0_4_ + (float)local_ac0._0_4_ * (float)local_a60._0_4_;
                auVar156 = vdpps_avx(auVar315,local_ae0._0_16_,0x7f);
                auVar84 = vdpps_avx(_local_b20,auVar187,0x7f);
                auVar123 = vdpps_avx(_local_9f0,local_ae0._0_16_,0x7f);
                auVar124 = vdpps_avx(_local_b20,auVar315,0x7f);
                fVar311 = auVar156._0_4_ + auVar84._0_4_;
                fVar312 = auVar87._0_4_;
                auVar92._0_4_ = fVar312 * fVar312;
                auVar92._4_4_ = auVar87._4_4_ * auVar87._4_4_;
                auVar92._8_4_ = auVar87._8_4_ * auVar87._8_4_;
                auVar92._12_4_ = auVar87._12_4_ * auVar87._12_4_;
                auVar84 = vsubps_avx(auVar181,auVar92);
                local_ae0._0_16_ = ZEXT416((uint)fVar311);
                auVar156 = vdpps_avx(_local_b20,_local_9f0,0x7f);
                fVar313 = auVar124._0_4_ - fVar312 * fVar311;
                local_ac0._0_16_ = auVar87;
                fVar312 = auVar156._0_4_ - fVar312 * auVar123._0_4_;
                auVar87 = vrsqrtss_avx(auVar84,auVar84);
                fVar314 = auVar84._0_4_;
                fVar311 = auVar87._0_4_;
                fVar311 = fVar311 * 1.5 + fVar314 * -0.5 * fVar311 * fVar311 * fVar311;
                if (fVar314 < 0.0) {
                  local_a40._0_16_ = auVar123;
                  local_7e0._0_4_ = fVar313;
                  local_940._0_4_ = fVar312;
                  local_9c0._0_4_ = fVar311;
                  fVar314 = sqrtf(fVar314);
                  fVar311 = (float)local_9c0._0_4_;
                  fVar313 = (float)local_7e0._0_4_;
                  fVar312 = (float)local_940._0_4_;
                  auVar123 = local_a40._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar84,auVar84);
                  fVar314 = auVar87._0_4_;
                }
                auVar331 = ZEXT3264(local_a20);
                auVar345 = ZEXT3264(local_b00);
                auVar93 = vpermilps_avx(local_980._0_16_,0xff);
                auVar124 = vshufps_avx(auVar262,auVar262,0xff);
                fVar313 = fVar313 * fVar311 - auVar124._0_4_;
                auVar206._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar123._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar123._12_4_ ^ 0x80000000;
                auVar230._0_4_ = -fVar313;
                auVar230._4_4_ = 0x80000000;
                auVar230._8_4_ = 0x80000000;
                auVar230._12_4_ = 0x80000000;
                auVar87 = vinsertps_avx(auVar230,ZEXT416((uint)(fVar312 * fVar311)),0x1c);
                auVar84 = vmovsldup_avx(ZEXT416((uint)(local_ae0._0_4_ * fVar312 * fVar311 -
                                                      auVar123._0_4_ * fVar313)));
                auVar87 = vdivps_avx(auVar87,auVar84);
                auVar156 = vinsertps_avx(local_ae0._0_16_,auVar206,0x10);
                auVar156 = vdivps_avx(auVar156,auVar84);
                auVar84 = vmovsldup_avx(local_ac0._0_16_);
                auVar93 = ZEXT416((uint)(fVar314 - auVar93._0_4_));
                auVar123 = vmovsldup_avx(auVar93);
                auVar159._0_4_ = auVar84._0_4_ * auVar87._0_4_ + auVar123._0_4_ * auVar156._0_4_;
                auVar159._4_4_ = auVar84._4_4_ * auVar87._4_4_ + auVar123._4_4_ * auVar156._4_4_;
                auVar159._8_4_ = auVar84._8_4_ * auVar87._8_4_ + auVar123._8_4_ * auVar156._8_4_;
                auVar159._12_4_ =
                     auVar84._12_4_ * auVar87._12_4_ + auVar123._12_4_ * auVar156._12_4_;
                auVar87 = vsubps_avx(auVar260,auVar159);
                auVar386 = ZEXT1664(auVar87);
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar260 = vandps_avx(local_ac0._0_16_,auVar160);
                auVar272 = ZEXT3264(local_9a0);
              } while (fVar310 <= auVar260._0_4_);
              auVar188._8_4_ = 0x7fffffff;
              auVar188._0_8_ = 0x7fffffff7fffffff;
              auVar188._12_4_ = 0x7fffffff;
              auVar260 = vandps_avx(auVar93,auVar188);
            } while ((float)local_9e0._0_4_ * 1.9073486e-06 + auVar184._0_4_ + fVar310 <=
                     auVar260._0_4_);
            fVar310 = auVar87._0_4_ + (float)local_8f0._0_4_;
            if ((fVar298 <= fVar310) &&
               (fVar311 = *(float *)(ray + k * 4 + 0x80), fVar310 <= fVar311)) {
              auVar260 = vmovshdup_avx(auVar87);
              fVar312 = auVar260._0_4_;
              if ((0.0 <= fVar312) && (fVar312 <= 1.0)) {
                auVar181 = vrsqrtss_avx(auVar181,auVar181);
                fVar313 = auVar181._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar73].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar181 = ZEXT416((uint)(fVar313 * 1.5 +
                                           fVar309 * -0.5 * fVar313 * fVar313 * fVar313));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar189._0_4_ = auVar181._0_4_ * (float)local_b20._0_4_;
                  auVar189._4_4_ = auVar181._4_4_ * (float)local_b20._4_4_;
                  auVar189._8_4_ = auVar181._8_4_ * fStack_b18;
                  auVar189._12_4_ = auVar181._12_4_ * fStack_b14;
                  auVar136._0_4_ = auVar262._0_4_ + auVar124._0_4_ * auVar189._0_4_;
                  auVar136._4_4_ = auVar262._4_4_ + auVar124._4_4_ * auVar189._4_4_;
                  auVar136._8_4_ = auVar262._8_4_ + auVar124._8_4_ * auVar189._8_4_;
                  auVar136._12_4_ = auVar262._12_4_ + auVar124._12_4_ * auVar189._12_4_;
                  auVar181 = vshufps_avx(auVar189,auVar189,0xc9);
                  auVar260 = vshufps_avx(auVar262,auVar262,0xc9);
                  auVar190._0_4_ = auVar260._0_4_ * auVar189._0_4_;
                  auVar190._4_4_ = auVar260._4_4_ * auVar189._4_4_;
                  auVar190._8_4_ = auVar260._8_4_ * auVar189._8_4_;
                  auVar190._12_4_ = auVar260._12_4_ * auVar189._12_4_;
                  auVar207._0_4_ = auVar262._0_4_ * auVar181._0_4_;
                  auVar207._4_4_ = auVar262._4_4_ * auVar181._4_4_;
                  auVar207._8_4_ = auVar262._8_4_ * auVar181._8_4_;
                  auVar207._12_4_ = auVar262._12_4_ * auVar181._12_4_;
                  auVar184 = vsubps_avx(auVar207,auVar190);
                  auVar181 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar260 = vshufps_avx(auVar136,auVar136,0xc9);
                  auVar208._0_4_ = auVar260._0_4_ * auVar181._0_4_;
                  auVar208._4_4_ = auVar260._4_4_ * auVar181._4_4_;
                  auVar208._8_4_ = auVar260._8_4_ * auVar181._8_4_;
                  auVar208._12_4_ = auVar260._12_4_ * auVar181._12_4_;
                  auVar181 = vshufps_avx(auVar184,auVar184,0xd2);
                  auVar137._0_4_ = auVar136._0_4_ * auVar181._0_4_;
                  auVar137._4_4_ = auVar136._4_4_ * auVar181._4_4_;
                  auVar137._8_4_ = auVar136._8_4_ * auVar181._8_4_;
                  auVar137._12_4_ = auVar136._12_4_ * auVar181._12_4_;
                  auVar181 = vsubps_avx(auVar208,auVar137);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    uVar1 = vextractps_avx(auVar181,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar181,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar181._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar312;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(uint *)(ray + k * 4 + 0x110) = local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar73;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_770 = vshufps_avx(auVar87,auVar87,0x55);
                    auVar260 = vshufps_avx(auVar181,auVar181,0x55);
                    auStack_790 = vshufps_avx(auVar181,auVar181,0xaa);
                    local_780 = vshufps_avx(auVar181,auVar181,0);
                    local_7a0 = (RTCHitN  [16])auVar260;
                    local_760 = ZEXT816(0) << 0x20;
                    local_750 = local_7c0._0_8_;
                    uStack_748 = local_7c0._8_8_;
                    local_740 = local_7b0;
                    vcmpps_avx(ZEXT1632(local_7b0),ZEXT1632(local_7b0),0xf);
                    uStack_72c = context->user->instID[0];
                    local_730 = uStack_72c;
                    uStack_728 = uStack_72c;
                    uStack_724 = uStack_72c;
                    uVar80 = context->user->instPrimID[0];
                    auVar138._4_4_ = uVar80;
                    auVar138._0_4_ = uVar80;
                    auVar138._8_4_ = uVar80;
                    auVar138._12_4_ = uVar80;
                    auStack_720 = auVar138;
                    *(float *)(ray + k * 4 + 0x80) = fVar310;
                    local_8e0 = *local_a88;
                    local_b50.valid = (int *)local_8e0;
                    local_b50.geometryUserPtr = pGVar7->userPtr;
                    local_b50.context = context->user;
                    local_b50.hit = local_7a0;
                    local_b50.N = 4;
                    local_b50.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_b50);
                      auVar272._8_56_ = extraout_var_00;
                      auVar272._0_8_ = extraout_XMM1_Qa_00;
                      auVar138 = auVar272._0_16_;
                      auVar272 = ZEXT3264(local_9a0);
                      auVar345 = ZEXT3264(local_b00);
                      auVar331 = ZEXT3264(local_a20);
                    }
                    if (local_8e0 == (undefined1  [16])0x0) {
                      auVar181 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar260 = vpcmpeqd_avx(auVar138,auVar138);
                      auVar181 = auVar181 ^ auVar260;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      auVar260 = vpcmpeqd_avx(auVar260,auVar260);
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_b50);
                        auVar272 = ZEXT3264(local_9a0);
                        auVar345 = ZEXT3264(local_b00);
                        auVar331 = ZEXT3264(local_a20);
                        auVar260 = vpcmpeqd_avx(auVar260,auVar260);
                      }
                      auVar184 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                      auVar181 = auVar184 ^ auVar260;
                      if (local_8e0 != (undefined1  [16])0x0) {
                        auVar184 = auVar184 ^ auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])local_b50.hit);
                        *(undefined1 (*) [16])(local_b50.ray + 0xc0) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x10));
                        *(undefined1 (*) [16])(local_b50.ray + 0xd0) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x20));
                        *(undefined1 (*) [16])(local_b50.ray + 0xe0) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x30));
                        *(undefined1 (*) [16])(local_b50.ray + 0xf0) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x40));
                        *(undefined1 (*) [16])(local_b50.ray + 0x100) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x50));
                        *(undefined1 (*) [16])(local_b50.ray + 0x110) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x60));
                        *(undefined1 (*) [16])(local_b50.ray + 0x120) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x70));
                        *(undefined1 (*) [16])(local_b50.ray + 0x130) = auVar260;
                        auVar260 = vmaskmovps_avx(auVar184,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x80));
                        *(undefined1 (*) [16])(local_b50.ray + 0x140) = auVar260;
                      }
                    }
                    auVar94._8_8_ = 0x100000001;
                    auVar94._0_8_ = 0x100000001;
                    if ((auVar94 & auVar181) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar311;
                    }
                  }
                }
              }
            }
LAB_0097a54a:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar320._4_4_ = uVar1;
            auVar320._0_4_ = uVar1;
            auVar320._8_4_ = uVar1;
            auVar320._12_4_ = uVar1;
            auVar320._16_4_ = uVar1;
            auVar320._20_4_ = uVar1;
            auVar320._24_4_ = uVar1;
            auVar320._28_4_ = uVar1;
            auVar386 = ZEXT3264(auVar320);
            auVar95 = vcmpps_avx(_local_800,auVar320,2);
          }
          auVar95 = vandps_avx(local_660,local_640);
          auVar107 = vandps_avx(local_840,_local_820);
          auVar170._0_4_ = (float)local_8a0._0_4_ + local_4e0._0_4_;
          auVar170._4_4_ = (float)local_8a0._4_4_ + local_4e0._4_4_;
          auVar170._8_4_ = fStack_898 + local_4e0._8_4_;
          auVar170._12_4_ = fStack_894 + local_4e0._12_4_;
          auVar170._16_4_ = fStack_890 + local_4e0._16_4_;
          auVar170._20_4_ = fStack_88c + local_4e0._20_4_;
          auVar170._24_4_ = fStack_888 + local_4e0._24_4_;
          auVar170._28_4_ = fStack_884 + local_4e0._28_4_;
          auVar181 = vshufps_avx(auVar386._0_16_,auVar386._0_16_,0);
          auVar218._16_16_ = auVar181;
          auVar218._0_16_ = auVar181;
          auVar10 = vcmpps_avx(auVar170,auVar218,2);
          auVar95 = vandps_avx(auVar10,auVar95);
          auVar241._0_4_ = (float)local_8a0._0_4_ + local_4a0._0_4_;
          auVar241._4_4_ = (float)local_8a0._4_4_ + local_4a0._4_4_;
          auVar241._8_4_ = fStack_898 + local_4a0._8_4_;
          auVar241._12_4_ = fStack_894 + local_4a0._12_4_;
          auVar241._16_4_ = fStack_890 + local_4a0._16_4_;
          auVar241._20_4_ = fStack_88c + local_4a0._20_4_;
          auVar241._24_4_ = fStack_888 + local_4a0._24_4_;
          auVar241._28_4_ = fStack_884 + local_4a0._28_4_;
          auVar10 = vcmpps_avx(auVar241,auVar218,2);
          auVar107 = vandps_avx(auVar10,auVar107);
          auVar107 = vorps_avx(auVar95,auVar107);
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar107 >> 0x7f,0) != '\0') ||
                (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0xbf,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar107[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar107;
            auVar95 = vblendvps_avx(_local_4a0,_local_4e0,auVar95);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar95;
            uVar76 = vmovlps_avx(local_610);
            (&uStack_140)[uVar78 * 0xc] = uVar76;
            auStack_138[uVar78 * 0x18] = local_ca8 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
          auVar386 = ZEXT3264(local_960);
          fVar309 = (float)local_8a0._0_4_;
          fVar364 = (float)local_8a0._4_4_;
          fVar172 = fStack_898;
          fVar173 = fStack_894;
          fVar174 = fStack_890;
          fVar175 = fStack_88c;
          fVar176 = fStack_888;
          fVar258 = fStack_884;
          goto LAB_00978fb8;
        }
      }
      auVar331 = ZEXT3264(local_a20);
      auVar386 = ZEXT3264(local_960);
      auVar345 = ZEXT3264(local_b00);
      auVar272 = ZEXT3264(local_9a0);
    }
LAB_00978fb8:
    while( true ) {
      auVar267 = local_5a0;
      uVar80 = (uint)uVar78;
      if (uVar80 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar112._4_4_ = uVar1;
        auVar112._0_4_ = uVar1;
        auVar112._8_4_ = uVar1;
        auVar112._12_4_ = uVar1;
        auVar112._16_4_ = uVar1;
        auVar112._20_4_ = uVar1;
        auVar112._24_4_ = uVar1;
        auVar112._28_4_ = uVar1;
        auVar95 = vcmpps_avx(local_400,auVar112,2);
        uVar73 = vmovmskps_avx(auVar95);
        uVar73 = (uint)uVar79 & uVar73;
        goto LAB_00977eb8;
      }
      uVar78 = (ulong)(uVar80 - 1);
      lVar75 = uVar78 * 0x60;
      auVar95 = *(undefined1 (*) [32])(auStack_160 + lVar75);
      auVar106._0_4_ = fVar309 + auVar95._0_4_;
      auVar106._4_4_ = fVar364 + auVar95._4_4_;
      auVar106._8_4_ = fVar172 + auVar95._8_4_;
      auVar106._12_4_ = fVar173 + auVar95._12_4_;
      auVar106._16_4_ = fVar174 + auVar95._16_4_;
      auVar106._20_4_ = fVar175 + auVar95._20_4_;
      auVar106._24_4_ = fVar176 + auVar95._24_4_;
      auVar106._28_4_ = fVar258 + auVar95._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar197._4_4_ = uVar1;
      auVar197._0_4_ = uVar1;
      auVar197._8_4_ = uVar1;
      auVar197._12_4_ = uVar1;
      auVar197._16_4_ = uVar1;
      auVar197._20_4_ = uVar1;
      auVar197._24_4_ = uVar1;
      auVar197._28_4_ = uVar1;
      auVar10 = vcmpps_avx(auVar106,auVar197,2);
      auVar107 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar75));
      _local_7a0 = auVar107;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar75) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar78 = (ulong)(uVar80 - 1);
    }
    auVar168._8_4_ = 0x7f800000;
    auVar168._0_8_ = 0x7f8000007f800000;
    auVar168._12_4_ = 0x7f800000;
    auVar168._16_4_ = 0x7f800000;
    auVar168._20_4_ = 0x7f800000;
    auVar168._24_4_ = 0x7f800000;
    auVar168._28_4_ = 0x7f800000;
    auVar95 = vblendvps_avx(auVar168,auVar95,auVar107);
    auVar10 = vshufps_avx(auVar95,auVar95,0xb1);
    auVar10 = vminps_avx(auVar95,auVar10);
    auVar11 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar11 = vperm2f128_avx(auVar10,auVar10,1);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar95 = vcmpps_avx(auVar95,auVar10,0);
    auVar10 = auVar107 & auVar95;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar107 = vandps_avx(auVar95,auVar107);
    }
    auVar126._8_8_ = 0;
    auVar126._0_8_ = (&uStack_140)[uVar78 * 0xc];
    local_ca8 = auStack_138[uVar78 * 0x18];
    uVar77 = vmovmskps_avx(auVar107);
    uVar74 = 0;
    if (uVar77 != 0) {
      for (; (uVar77 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
      }
    }
    *(undefined4 *)(local_7a0 + (ulong)uVar74 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar75) = _local_7a0;
    uVar77 = uVar80 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar77 = uVar80;
    }
    auVar181 = vshufps_avx(auVar126,auVar126,0);
    auVar260 = vshufps_avx(auVar126,auVar126,0x55);
    auVar260 = vsubps_avx(auVar260,auVar181);
    local_4e0._4_4_ = auVar181._4_4_ + auVar260._4_4_ * 0.14285715;
    local_4e0._0_4_ = auVar181._0_4_ + auVar260._0_4_ * 0.0;
    fStack_4d8 = auVar181._8_4_ + auVar260._8_4_ * 0.2857143;
    fStack_4d4 = auVar181._12_4_ + auVar260._12_4_ * 0.42857146;
    fStack_4d0 = auVar181._0_4_ + auVar260._0_4_ * 0.5714286;
    fStack_4cc = auVar181._4_4_ + auVar260._4_4_ * 0.71428573;
    fStack_4c8 = auVar181._8_4_ + auVar260._8_4_ * 0.8571429;
    fStack_4c4 = auVar181._12_4_ + auVar260._12_4_;
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar74 * 4);
    uVar78 = (ulong)uVar77;
    auVar344 = auVar345._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }